

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

DisasJumpType translate_one(CPUS390XState_conflict *env,DisasContext_conflict13 *s)

{
  DisasField DVar1;
  TCGContext_conflict12 *tcg_ctx;
  abi_ptr addr;
  target_ulong pc;
  uint64_t addr_00;
  uc_struct_conflict14 *val;
  hook *phVar2;
  _Bool _Var3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  DisasJumpType DVar7;
  int iVar8;
  uintptr_t o_5;
  TCGv_i32 pTVar9;
  TCGv_i64 pTVar10;
  TCGv_i64 pTVar11;
  uint uVar12;
  target_ulong a2;
  byte bVar13;
  uint uVar14;
  byte bVar15;
  uint uVar16;
  uintptr_t o_1;
  long lVar17;
  uintptr_t o_2;
  TCGTemp *ts;
  uintptr_t o_3;
  TCGTemp *ts_00;
  list_item *plVar18;
  uint uVar19;
  uintptr_t o_4;
  ulong uVar20;
  ulong uVar21;
  TCGTemp *ts_01;
  DisasInsn *local_c8;
  DisasOps o;
  TCGTemp *local_78;
  TCGTemp *local_70;
  TCGTemp *local_68;
  TCGTemp *local_60;
  TCGTemp *local_58;
  TCGTemp *local_50;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  tcg_ctx = s->uc->tcg_ctx;
  o.in2 = (TCGv_i64)0x0;
  o.addr1 = (TCGv_i64)0x0;
  o.out2 = (TCGv_i64)0x0;
  o.in1 = (TCGv_i64)0x0;
  o.g_out = false;
  o.g_out2 = false;
  o.g_in1 = false;
  o.g_in2 = false;
  o._4_4_ = 0;
  o.out = (TCGv_i64)0x0;
  if (s->ex_value == 0) {
    addr = (s->base).pc_next;
    uVar4 = cpu_lduw_code_s390x(env,addr);
    uVar16 = uVar4 >> 8 & 0xff;
    if ((uVar16 >> 6) - 1 < 2) {
      a2 = 4;
      uVar4 = cpu_ldl_code_s390x(env,addr);
      uVar20 = (ulong)uVar4 << 0x20;
    }
    else if (uVar16 >> 6 == 0) {
      uVar20 = (ulong)uVar4 << 0x30;
      a2 = 2;
    }
    else {
      a2 = 6;
      uVar5 = cpu_ldl_code_s390x(env,addr + 2);
      uVar20 = (ulong)uVar4 << 0x30 | (ulong)uVar5 << 0x10;
    }
  }
  else {
    pTVar10 = tcg_const_i64_s390x(tcg_ctx,0);
    tcg_gen_st_i64_s390x(tcg_ctx,pTVar10,tcg_ctx->cpu_env,0x338);
    tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(pTVar10 + (long)tcg_ctx));
    uVar21 = s->ex_value;
    uVar20 = uVar21 & 0xffffffffffff0000;
    a2 = (target_ulong)((uint)uVar21 & 0xf);
    uVar16 = (uint)(byte)(uVar21 >> 0x38);
  }
  pc = (s->base).pc_next;
  s->pc_tmp = pc + a2;
  s->ilen = (uint32_t)a2;
  uVar6 = 0;
  switch(uVar16) {
  case 0x94:
  case 0x95:
  case 0x96:
  case 0x97:
  case 0x98:
  case 0x99:
  case 0x9a:
  case 0x9b:
  case 0x9c:
  case 0x9d:
  case 0x9e:
  case 0x9f:
  case 0xa0:
  case 0xa1:
  case 0xa2:
  case 0xa3:
  case 0xa4:
  case 0xa6:
  case 0xa8:
  case 0xa9:
  case 0xaa:
  case 0xab:
  case 0xac:
  case 0xad:
  case 0xae:
  case 0xaf:
  case 0xb0:
  case 0xb1:
  case 0xb4:
  case 0xb5:
  case 0xb6:
  case 0xb7:
  case 0xb8:
  case 0xba:
  case 0xbb:
  case 0xbc:
  case 0xbd:
  case 0xbe:
  case 0xbf:
  case 0xc1:
  case 0xc3:
  case 0xc9:
  case 0xca:
  case 0xcb:
  case 0xcd:
  case 0xce:
  case 0xcf:
  case 0xe0:
  case 0xe3:
  case 0xe4:
  case 0xe6:
  case 0xe7:
  case 0xeb:
  case 0xec:
  case 0xed:
  case 0xf4:
  case 0xf5:
  case 0xf6:
  case 0xf7:
switchD_00ae572b_caseD_94:
    uVar6 = (uint)(byte)(uVar20 >> 0x10);
    break;
  case 0xa5:
  case 0xa7:
  case 0xc0:
  case 0xc2:
  case 0xc4:
  case 0xc6:
  case 200:
  case 0xcc:
    uVar6 = (ushort)(uVar20 >> 0x30) & 0xf;
    break;
  case 0xc5:
  case 199:
  case 0xd0:
  case 0xd1:
  case 0xd2:
  case 0xd3:
  case 0xd4:
  case 0xd5:
  case 0xd6:
  case 0xd7:
  case 0xd8:
  case 0xd9:
  case 0xda:
  case 0xdb:
  case 0xdc:
  case 0xdd:
  case 0xde:
  case 0xdf:
  case 0xe1:
  case 0xe2:
  case 0xe8:
  case 0xe9:
  case 0xea:
  case 0xee:
  case 0xef:
  case 0xf0:
  case 0xf1:
  case 0xf2:
  case 0xf3:
  case 0xf8:
  case 0xf9:
  case 0xfa:
  case 0xfb:
  case 0xfc:
  case 0xfd:
    break;
  default:
    if (((uVar16 != 1) && (uVar16 != 0x82)) && (uVar16 != 0x80)) goto switchD_00ae572b_caseD_94;
  case 0x93:
  case 0xb2:
  case 0xb3:
  case 0xb9:
  case 0xe5:
    uVar6 = (uint)(byte)(uVar20 >> 0x30);
  }
  *(undefined8 *)&(s->fields).field_0x8 = 0;
  (s->fields).c[0] = 0;
  (s->fields).c[1] = 0;
  (s->fields).c[2] = 0;
  (s->fields).c[3] = 0;
  (s->fields).c[4] = 0;
  (s->fields).c[5] = 0;
  *(undefined8 *)((s->fields).c + 6) = 0;
  (s->fields).raw_insn = uVar20;
  *(uint *)&(s->fields).field_0x8 = uVar6 << 8 | uVar16;
  switch(uVar6 + uVar16 * 0x100) {
  case 0xe700:
    local_c8 = insn_info + 0x297;
    break;
  case 0xe701:
    local_c8 = insn_info + 0x298;
    break;
  case 0xe702:
    local_c8 = insn_info + 0x29a;
    break;
  case 0xe703:
    local_c8 = insn_info + 0x299;
    break;
  case 0xe704:
    local_c8 = insn_info + 0x2a0;
    break;
  case 0xe705:
    local_c8 = insn_info + 0x296;
    break;
  case 0xe706:
    local_c8 = insn_info + 0x294;
    break;
  case 0xe707:
    local_c8 = insn_info + 0x2a2;
    break;
  case 0xe708:
    local_c8 = insn_info + 0x2b4;
    break;
  case 0xe709:
    local_c8 = insn_info + 0x2b5;
    break;
  case 0xe70a:
    local_c8 = insn_info + 0x2b7;
    break;
  case 0xe70b:
    local_c8 = insn_info + 0x2b6;
    break;
  case 0xe70c:
  case 0xe70d:
  case 0xe70f:
  case 0xe710:
  case 0xe711:
  case 0xe714:
  case 0xe715:
  case 0xe716:
  case 0xe717:
  case 0xe718:
  case 0xe719:
  case 0xe71c:
  case 0xe71d:
  case 0xe71e:
  case 0xe71f:
  case 0xe720:
  case 0xe723:
  case 0xe724:
  case 0xe725:
  case 0xe726:
  case 0xe728:
  case 0xe729:
  case 0xe72a:
  case 0xe72b:
  case 0xe72c:
  case 0xe72d:
  case 0xe72e:
  case 0xe72f:
  case 0xe731:
  case 0xe732:
  case 0xe734:
  case 0xe735:
  case 0xe739:
  case 0xe73b:
  case 0xe73c:
  case 0xe73d:
  case 0xe747:
  case 0xe748:
  case 0xe749:
  case 0xe74b:
  case 0xe74c:
  case 0xe74e:
  case 0xe74f:
  case 0xe751:
  case 0xe754:
  case 0xe755:
  case 0xe757:
  case 0xe758:
  case 0xe759:
  case 0xe75a:
  case 0xe75b:
  case 0xe75d:
  case 0xe75e:
  case 0xe763:
  case 0xe771:
  case 0xe776:
  case 0xe779:
  case 0xe77b:
  case 0xe783:
  case 0xe785:
  case 0xe786:
  case 0xe787:
  case 0xe788:
  case 0xe789:
  case 0xe78b:
  case 0xe790:
  case 0xe791:
  case 0xe792:
  case 0xe793:
  case 0xe796:
  case 0xe798:
  case 0xe799:
  case 0xe79a:
  case 0xe79b:
  case 0xe79c:
  case 0xe79d:
  case 0xe79e:
  case 0xe79f:
  case 0xe7a0:
  case 0xe7a8:
  case 0xe7b0:
  case 0xe7b1:
  case 0xe7b2:
  case 0xe7b3:
  case 0xe7b5:
  case 0xe7b6:
  case 0xe7b7:
  case 0xe7b8:
  case 0xe7ba:
  case 0xe7be:
  case 0xe7c6:
  case 0xe7c8:
  case 0xe7c9:
  case 0xe7cd:
  case 0xe7cf:
  case 0xe7d0:
  case 0xe7d1:
  case 0xe7d2:
  case 0xe7d3:
  case 0xe7da:
  case 0xe7dc:
  case 0xe7dd:
  case 0xe7e0:
  case 0xe7e1:
  case 0xe7e4:
  case 0xe7e6:
  case 0xe7e9:
  case 0xe7ec:
  case 0xe7ed:
  case 0xe7ee:
  case 0xe7ef:
  case 0xe7f4:
  case 0xe7f6:
  case 0xe7fa:
switchD_00ae616d_caseD_eb7b:
    s->insn = (DisasInsn *)0x0;
    local_c8 = (DisasInsn *)0x0;
    goto LAB_00ae8a2e;
  case 0xe70e:
    local_c8 = insn_info + 0x2b3;
    break;
  case 0xe712:
    local_c8 = insn_info + 0x291;
    break;
  case 0xe713:
    local_c8 = insn_info + 0x290;
    break;
  case 0xe71a:
    local_c8 = insn_info + 0x2b0;
    break;
  case 0xe71b:
    local_c8 = insn_info + 0x2af;
    break;
  case 0xe721:
    local_c8 = insn_info + 0x29f;
    break;
  case 0xe722:
    local_c8 = insn_info + 0x2a3;
    break;
  case 0xe727:
    local_c8 = insn_info + 0x14e;
    break;
  case 0xe730:
    local_c8 = insn_info + 0x2ef;
    break;
  case 0xe733:
    local_c8 = insn_info + 0x2ec;
    break;
  case 0xe736:
    local_c8 = insn_info + 0x2a1;
    break;
  case 0xe737:
    local_c8 = insn_info + 0x2a5;
    break;
  case 0xe738:
    local_c8 = insn_info + 0x2f3;
    break;
  case 0xe73a:
    local_c8 = insn_info + 0x2f1;
    break;
  case 0xe73e:
    local_c8 = insn_info + 0x2b8;
    break;
  case 0xe73f:
    local_c8 = insn_info + 0x2b9;
    break;
  case 0xe740:
    local_c8 = insn_info + 0x29b;
    break;
  case 0xe741:
    local_c8 = insn_info + 0x29c;
    break;
  case 0xe742:
    local_c8 = insn_info + 0x29e;
    break;
  case 0xe743:
    local_c8 = insn_info + 0x29d;
    break;
  case 0xe744:
    local_c8 = insn_info + 0x292;
    break;
  case 0xe745:
    local_c8 = insn_info + 0x2ae;
    break;
  case 0xe746:
    local_c8 = insn_info + 0x293;
    break;
  case 0xe74a:
    local_c8 = insn_info + 0x31c;
    break;
  case 0xe74d:
    local_c8 = insn_info + 0x2ad;
    break;
  case 0xe750:
    local_c8 = insn_info + 0x2ea;
    break;
  case 0xe752:
    local_c8 = insn_info + 0x2cd;
    break;
  case 0xe753:
    local_c8 = insn_info + 0x2cc;
    break;
  case 0xe756:
    local_c8 = insn_info + 0x295;
    break;
  case 0xe75c:
    local_c8 = insn_info + 0x306;
    break;
  case 0xe75f:
    local_c8 = insn_info + 0x2b2;
    break;
  case 0xe760:
    local_c8 = insn_info + 0x2a7;
    break;
  case 0xe761:
    local_c8 = insn_info + 0x2a6;
    break;
  case 0xe762:
    local_c8 = insn_info + 0x2a4;
    break;
  case 0xe764:
    local_c8 = insn_info + 0x301;
    break;
  case 0xe765:
    local_c8 = insn_info + 0x2ff;
    break;
  case 0xe766:
    local_c8 = insn_info + 0x2c6;
    break;
  case 0xe767:
    local_c8 = insn_info + 0x300;
    break;
  case 0xe768:
    local_c8 = insn_info + 0x2c2;
    break;
  case 0xe769:
    local_c8 = insn_info + 0x2c3;
    break;
  case 0xe76a:
    local_c8 = insn_info + 0x2e8;
    break;
  case 0xe76b:
    local_c8 = insn_info + 0x2e6;
    break;
  case 0xe76c:
    local_c8 = insn_info + 0x2e7;
    break;
  case 0xe76d:
    local_c8 = insn_info + 0x2ce;
    break;
  case 0xe76e:
    local_c8 = insn_info + 0x2e5;
    break;
  case 0xe76f:
    local_c8 = insn_info + 0x2e9;
    break;
  case 0xe770:
    local_c8 = insn_info + 0x2ee;
    break;
  case 0xe772:
    local_c8 = insn_info + 0x2ed;
    break;
  case 0xe773:
    local_c8 = insn_info + 0x2eb;
    break;
  case 0xe774:
    local_c8 = insn_info + 0x2f4;
    break;
  case 0xe775:
    local_c8 = insn_info + 0x2f5;
    break;
  case 0xe777:
    local_c8 = insn_info + 0x2f6;
    break;
  case 0xe778:
    local_c8 = insn_info + 0x2f2;
    break;
  case 0xe77a:
    local_c8 = insn_info + 0x2f0;
    break;
  case 0xe77c:
    local_c8 = insn_info + 0x2f9;
    break;
  case 0xe77d:
    local_c8 = insn_info + 0x2fa;
    break;
  case 0xe77e:
    local_c8 = insn_info + 0x2f7;
    break;
  case 0xe77f:
    local_c8 = insn_info + 0x2f8;
    break;
  case 0xe780:
    local_c8 = insn_info + 0x304;
    break;
  case 0xe781:
    local_c8 = insn_info + 0x305;
    break;
  case 0xe782:
    local_c8 = insn_info + 0x303;
    break;
  case 0xe784:
    local_c8 = insn_info + 0x2ac;
    break;
  case 0xe78a:
    local_c8 = insn_info + 0x307;
    break;
  case 0xe78c:
    local_c8 = insn_info + 0x2ab;
    break;
  case 0xe78d:
    local_c8 = insn_info + 0x2b1;
    break;
  case 0xe78e:
    local_c8 = insn_info + 0x318;
    break;
  case 0xe78f:
    local_c8 = insn_info + 0x317;
    break;
  case 0xe794:
    local_c8 = insn_info + 0x2a8;
    break;
  case 0xe795:
    local_c8 = insn_info + 0x2aa;
    break;
  case 0xe797:
    local_c8 = insn_info + 0x2a9;
    break;
  case 0xe7a1:
    local_c8 = insn_info + 0x2df;
    break;
  case 0xe7a2:
    local_c8 = insn_info + 0x2e0;
    break;
  case 0xe7a3:
    local_c8 = insn_info + 0x2de;
    break;
  case 0xe7a4:
    local_c8 = insn_info + 0x2e2;
    break;
  case 0xe7a5:
    local_c8 = insn_info + 0x2e4;
    break;
  case 0xe7a6:
    local_c8 = insn_info + 0x2e1;
    break;
  case 0xe7a7:
    local_c8 = insn_info + 0x2e3;
    break;
  case 0xe7a9:
    local_c8 = insn_info + 0x2d9;
    break;
  case 0xe7aa:
    local_c8 = insn_info + 0x2d7;
    break;
  case 0xe7ab:
    local_c8 = insn_info + 0x2d8;
    break;
  case 0xe7ac:
    local_c8 = insn_info + 0x2db;
    break;
  case 0xe7ad:
    local_c8 = insn_info + 0x2dd;
    break;
  case 0xe7ae:
    local_c8 = insn_info + 0x2da;
    break;
  case 0xe7af:
    local_c8 = insn_info + 0x2dc;
    break;
  case 0xe7b4:
    local_c8 = insn_info + 0x2cf;
    break;
  case 0xe7b9:
    local_c8 = insn_info + 0x2c1;
    break;
  case 0xe7bb:
    local_c8 = insn_info + 0x2c0;
    break;
  case 0xe7bc:
    local_c8 = insn_info + 0x2d0;
    break;
  case 0xe7bd:
    local_c8 = insn_info + 0x2fe;
    break;
  case 0xe7bf:
    local_c8 = insn_info + 0x2fd;
    break;
  case 0xe7c0:
    local_c8 = insn_info + 0x311;
    break;
  case 0xe7c1:
    local_c8 = insn_info + 0x30f;
    break;
  case 0xe7c2:
    local_c8 = insn_info + 0x310;
    break;
  case 0xe7c3:
    local_c8 = insn_info + 0x30e;
    break;
  case 0xe7c4:
    local_c8 = insn_info + 0x314;
    break;
  case 0xe7c5:
    local_c8 = insn_info + 0x315;
    break;
  case 0xe7c7:
    local_c8 = insn_info + 0x313;
    break;
  case 0xe7ca:
    local_c8 = insn_info + 0x30a;
    break;
  case 0xe7cb:
    local_c8 = insn_info + 0x309;
    break;
  case 0xe7cc:
    local_c8 = insn_info + 0x319;
    break;
  case 0xe7ce:
    local_c8 = insn_info + 0x31a;
    break;
  case 0xe7d4:
    local_c8 = insn_info + 0x2bd;
    break;
  case 0xe7d5:
    local_c8 = insn_info + 699;
    break;
  case 0xe7d6:
    local_c8 = insn_info + 700;
    break;
  case 0xe7d7:
    local_c8 = insn_info + 0x2ba;
    break;
  case 0xe7d8:
    local_c8 = insn_info + 0x302;
    break;
  case 0xe7d9:
    local_c8 = insn_info + 0x2c8;
    break;
  case 0xe7db:
    local_c8 = insn_info + 0x2c7;
    break;
  case 0xe7de:
    local_c8 = insn_info + 0x2d1;
    break;
  case 0xe7df:
    local_c8 = insn_info + 0x2d2;
    break;
  case 0xe7e2:
    local_c8 = insn_info + 0x31b;
    break;
  case 0xe7e3:
    local_c8 = insn_info + 0x308;
    break;
  case 0xe7e5:
    local_c8 = insn_info + 0x312;
    break;
  case 0xe7e7:
    local_c8 = insn_info + 0x316;
    break;
  case 0xe7e8:
    local_c8 = insn_info + 0x30b;
    break;
  case 0xe7ea:
    local_c8 = insn_info + 0x30d;
    break;
  case 0xe7eb:
    local_c8 = insn_info + 0x30c;
    break;
  case 0xe7f0:
    local_c8 = insn_info + 0x2c5;
    break;
  case 0xe7f1:
    local_c8 = insn_info + 0x2bf;
    break;
  case 0xe7f2:
    local_c8 = insn_info + 0x2c4;
    break;
  case 0xe7f3:
    local_c8 = insn_info + 0x2be;
    break;
  case 0xe7f5:
    local_c8 = insn_info + 0x2fc;
    break;
  case 0xe7f7:
    local_c8 = insn_info + 0x2fb;
    break;
  case 0xe7f8:
    local_c8 = insn_info + 0x2c9;
    break;
  case 0xe7f9:
    local_c8 = insn_info + 0x2cb;
    break;
  case 0xe7fb:
    local_c8 = insn_info + 0x2ca;
    break;
  case 0xe7fc:
    local_c8 = insn_info + 0x2d6;
    break;
  case 0xe7fd:
    local_c8 = insn_info + 0x2d4;
    break;
  case 0xe7fe:
    local_c8 = insn_info + 0x2d5;
    break;
  case 0xe7ff:
    local_c8 = insn_info + 0x2d3;
    break;
  case 0xe800:
    local_c8 = insn_info + 0x1b4;
    break;
  default:
    uVar6 = uVar6 | uVar16 * 0x100;
    switch(uVar6) {
    case 0xb900:
      local_c8 = insn_info + 0x18a;
      break;
    case 0xb901:
      local_c8 = insn_info + 0x177;
      break;
    case 0xb902:
      local_c8 = insn_info + 0x135;
      break;
    case 0xb903:
      local_c8 = insn_info + 0x148;
      break;
    case 0xb904:
      local_c8 = insn_info + 0x116;
      break;
    case 0xb905:
      local_c8 = insn_info + 0x32c;
      break;
    case 0xb906:
      local_c8 = insn_info + 0x143;
      break;
    case 0xb907:
      local_c8 = insn_info + 0x150;
      break;
    case 0xb908:
      local_c8 = insn_info + 4;
      break;
    case 0xb909:
      local_c8 = insn_info + 0x24e;
      break;
    case 0xb90a:
      local_c8 = insn_info + 0x1f;
      break;
    case 0xb90b:
      local_c8 = insn_info + 0x260;
      break;
    case 0xb90c:
      local_c8 = insn_info + 0x1d5;
      break;
    case 0xb90d:
      local_c8 = insn_info + 0xef;
      break;
    case 0xb90e:
    case 0xb915:
    case 0xb922:
    case 0xb923:
    case 0xb924:
    case 0xb929:
    case 0xb932:
    case 0xb933:
    case 0xb934:
    case 0xb935:
    case 0xb936:
    case 0xb937:
    case 0xb938:
    case 0xb939:
    case 0xb93a:
    case 0xb93b:
    case 0xb93d:
    case 0xb940:
    case 0xb941:
    case 0xb942:
    case 0xb943:
    case 0xb944:
    case 0xb945:
    case 0xb947:
    case 0xb948:
    case 0xb949:
    case 0xb94a:
    case 0xb94b:
    case 0xb94c:
    case 0xb94d:
    case 0xb94e:
    case 0xb94f:
    case 0xb950:
    case 0xb951:
    case 0xb952:
    case 0xb953:
    case 0xb954:
    case 0xb955:
    case 0xb956:
    case 0xb957:
    case 0xb958:
    case 0xb959:
    case 0xb95a:
    case 0xb95b:
    case 0xb95c:
    case 0xb95d:
    case 0xb95e:
    case 0xb95f:
    case 0xb962:
    case 0xb963:
    case 0xb964:
    case 0xb965:
    case 0xb966:
    case 0xb967:
    case 0xb968:
    case 0xb969:
    case 0xb96a:
    case 0xb96b:
    case 0xb96c:
    case 0xb96d:
    case 0xb96e:
    case 0xb96f:
    case 0xb970:
    case 0xb971:
    case 0xb974:
    case 0xb975:
    case 0xb976:
    case 0xb977:
    case 0xb978:
    case 0xb979:
    case 0xb97a:
    case 0xb97b:
    case 0xb97c:
    case 0xb97d:
    case 0xb97e:
    case 0xb97f:
    case 0xb98b:
    case 0xb98c:
    case 0xb98f:
    case 0xb99a:
    case 0xb99b:
    case 0xb99c:
    case 0xb99d:
    case 0xb99e:
    case 0xb99f:
    case 0xb9a1:
    case 0xb9a2:
    case 0xb9a3:
    case 0xb9a4:
    case 0xb9a5:
    case 0xb9a6:
    case 0xb9a7:
    case 0xb9a8:
    case 0xb9a9:
    case 0xb9aa:
    case 0xb9ab:
    case 0xb9ac:
    case 0xb9ad:
    case 0xb9ae:
    case 0xb9af:
    case 0xb9b4:
    case 0xb9b5:
    case 0xb9b6:
    case 0xb9b7:
    case 0xb9b8:
    case 0xb9b9:
    case 0xb9ba:
    case 0xb9bb:
    case 0xb9bc:
    case 0xb9bd:
    case 0xb9bf:
    case 0xb9c0:
    case 0xb9c1:
    case 0xb9c2:
    case 0xb9c3:
    case 0xb9c4:
    case 0xb9c5:
    case 0xb9c6:
    case 0xb9c7:
    case 0xb9cc:
    case 0xb9ce:
    case 0xb9d1:
    case 0xb9d4:
    case 0xb9d5:
    case 0xb9d6:
    case 0xb9d7:
    case 0xb9dc:
    case 0xb9de:
    case 0xb9e3:
    case 0xb9e5:
    case 0xb9ec:
    case 0xb9ed:
    case 0xb9ee:
    case 0xb9ef:
    case 0xb9f0:
    case 0xb9f1:
    case 0xb9f3:
    case 0xb9f5:
    case 0xb9fc:
    case 0xb9fd:
    case 0xb9fe:
    case 0xb9ff:
      goto switchD_00ae616d_caseD_eb7b;
    case 0xb90f:
      local_c8 = insn_info + 0x191;
      break;
    case 0xb910:
      local_c8 = insn_info + 0x18b;
      break;
    case 0xb911:
      local_c8 = insn_info + 0x178;
      break;
    case 0xb912:
      local_c8 = insn_info + 0x136;
      break;
    case 0xb913:
      local_c8 = insn_info + 0x149;
      break;
    case 0xb914:
      local_c8 = insn_info + 0x117;
      break;
    case 0xb916:
      local_c8 = insn_info + 0x15b;
      break;
    case 0xb917:
      local_c8 = insn_info + 0x171;
      break;
    case 0xb918:
      local_c8 = insn_info + 5;
      break;
    case 0xb919:
      local_c8 = insn_info + 0x24f;
      break;
    case 0xb91a:
      local_c8 = insn_info + 0x20;
      break;
    case 0xb91b:
      local_c8 = insn_info + 0x261;
      break;
    case 0xb91c:
      local_c8 = insn_info + 0x1d6;
      break;
    case 0xb91d:
      local_c8 = insn_info + 0xf0;
      break;
    case 0xb91e:
      local_c8 = insn_info + 0x285;
      break;
    case 0xb91f:
      local_c8 = insn_info + 400;
      break;
    case 0xb920:
      local_c8 = insn_info + 99;
      break;
    case 0xb921:
      local_c8 = insn_info + 0x87;
      break;
    case 0xb925:
      local_c8 = insn_info + 0x348;
      break;
    case 0xb926:
      local_c8 = insn_info + 0x142;
      break;
    case 0xb927:
      local_c8 = insn_info + 0x14f;
      break;
    case 0xb928:
      local_c8 = insn_info + 0x286;
      break;
    case 0xb92a:
      local_c8 = insn_info + 0x287;
      break;
    case 0xb92b:
      local_c8 = insn_info + 0x288;
      break;
    case 0xb92c:
      local_c8 = insn_info + 0x289;
      break;
    case 0xb92d:
      local_c8 = insn_info + 0x28a;
      break;
    case 0xb92e:
      local_c8 = insn_info + 0x28b;
      break;
    case 0xb92f:
      local_c8 = insn_info + 0x28c;
      break;
    case 0xb930:
      local_c8 = insn_info + 100;
      break;
    case 0xb931:
      local_c8 = insn_info + 0x88;
      break;
    case 0xb93c:
      local_c8 = insn_info + 0x28d;
      break;
    case 0xb93e:
      local_c8 = insn_info + 0x28e;
      break;
    case 0xb93f:
      local_c8 = insn_info + 0x28f;
      break;
    case 0xb946:
      local_c8 = insn_info + 0x4d;
      break;
    case 0xb960:
      local_c8 = insn_info + 0xbb;
      break;
    case 0xb961:
      local_c8 = insn_info + 0xbf;
      break;
    case 0xb972:
      local_c8 = insn_info + 0xba;
      break;
    case 0xb973:
      local_c8 = insn_info + 0xbe;
      break;
    case 0xb980:
      local_c8 = insn_info + 0x36;
      break;
    case 0xb981:
      local_c8 = insn_info + 0x1e7;
      break;
    case 0xb982:
      local_c8 = insn_info + 0xf7;
      break;
    case 0xb983:
      local_c8 = insn_info + 0x106;
      break;
    case 0xb984:
      local_c8 = insn_info + 0x160;
      break;
    case 0xb985:
      local_c8 = insn_info + 0x165;
      break;
    case 0xb986:
      local_c8 = insn_info + 0x1d0;
      break;
    case 0xb987:
      local_c8 = insn_info + 0xed;
      break;
    case 0xb988:
      local_c8 = insn_info + 0x2f;
      break;
    case 0xb989:
      local_c8 = insn_info + 0x26a;
      break;
    case 0xb98a:
      local_c8 = insn_info + 0x31e;
      break;
    case 0xb98d:
      local_c8 = insn_info + 0x105;
      break;
    case 0xb98e:
      local_c8 = insn_info + 0x321;
      break;
    case 0xb990:
      local_c8 = insn_info + 0x281;
      break;
    case 0xb991:
      local_c8 = insn_info + 0x280;
      break;
    case 0xb992:
      local_c8 = insn_info + 0x27f;
      break;
    case 0xb993:
      local_c8 = insn_info + 0x27e;
      break;
    case 0xb994:
      local_c8 = insn_info + 0x15f;
      break;
    case 0xb995:
      local_c8 = insn_info + 0x164;
      break;
    case 0xb996:
      local_c8 = insn_info + 0x1ce;
      break;
    case 0xb997:
      local_c8 = insn_info + 0xeb;
      break;
    case 0xb998:
      local_c8 = insn_info + 0x2e;
      break;
    case 0xb999:
      local_c8 = insn_info + 0x269;
      break;
    case 0xb9a0:
      local_c8 = insn_info + 0x35d;
      break;
    case 0xb9b0:
      local_c8 = insn_info + 0xdf;
      break;
    case 0xb9b1:
      local_c8 = insn_info + 0xe1;
      break;
    case 0xb9b2:
      local_c8 = insn_info + 0xe2;
      break;
    case 0xb9b3:
      local_c8 = insn_info + 0xe3;
      break;
    case 0xb9be:
      local_c8 = insn_info + 0x204;
      break;
    case 0xb9c8:
      local_c8 = insn_info + 0xe;
      break;
    case 0xb9c9:
      local_c8 = insn_info + 0x25a;
      break;
    case 0xb9ca:
      local_c8 = insn_info + 0x24;
      break;
    case 0xb9cb:
      local_c8 = insn_info + 0x265;
      break;
    case 0xb9cd:
      local_c8 = insn_info + 0x80;
      break;
    case 0xb9cf:
      local_c8 = insn_info + 0x8c;
      break;
    case 0xb9d0:
      local_c8 = insn_info + 0x35e;
      break;
    case 0xb9d2:
      local_c8 = insn_info + 0x35f;
      break;
    case 0xb9d3:
      local_c8 = insn_info + 0x360;
      break;
    case 0xb9d8:
      local_c8 = insn_info + 0xf;
      break;
    case 0xb9d9:
      local_c8 = insn_info + 0x25b;
      break;
    case 0xb9da:
      local_c8 = insn_info + 0x25;
      break;
    case 0xb9db:
      local_c8 = insn_info + 0x266;
      break;
    case 0xb9dd:
      local_c8 = insn_info + 0x81;
      break;
    case 0xb9df:
      local_c8 = insn_info + 0x8d;
      break;
    case 0xb9e0:
      local_c8 = insn_info + 0x184;
      break;
    case 0xb9e1:
      local_c8 = insn_info + 0x1f9;
      break;
    case 0xb9e2:
      local_c8 = insn_info + 0x17e;
      break;
    case 0xb9e4:
      local_c8 = insn_info + 0x37;
      break;
    case 0xb9e6:
      local_c8 = insn_info + 0x1e8;
      break;
    case 0xb9e7:
      local_c8 = insn_info + 0xf8;
      break;
    case 0xb9e8:
      local_c8 = insn_info + 6;
      break;
    case 0xb9e9:
      local_c8 = insn_info + 0x250;
      break;
    case 0xb9ea:
      local_c8 = insn_info + 0x21;
      break;
    case 0xb9eb:
      local_c8 = insn_info + 0x262;
      break;
    case 0xb9f2:
      local_c8 = insn_info + 0x17d;
      break;
    case 0xb9f4:
      local_c8 = insn_info + 0x33;
      break;
    case 0xb9f6:
      local_c8 = insn_info + 0x1e4;
      break;
    case 0xb9f7:
      local_c8 = insn_info + 0xf4;
      break;
    case 0xb9f8:
      local_c8 = insn_info + 1;
      break;
    case 0xb9f9:
      local_c8 = insn_info + 0x24b;
      break;
    case 0xb9fa:
      local_c8 = insn_info + 0x1c;
      break;
    case 0xb9fb:
      local_c8 = insn_info + 0x25d;
      break;
    case 0xba00:
      local_c8 = insn_info + 0xb3;
      break;
    default:
      switch(uVar6) {
      case 0xe302:
        local_c8 = insn_info + 0x138;
        break;
      case 0xe303:
        local_c8 = insn_info + 0x32a;
        break;
      case 0xe304:
        local_c8 = insn_info + 0x118;
        break;
      case 0xe305:
      case 0xe306:
      case 0xe307:
      case 0xe30e:
      case 0xe310:
      case 0xe311:
      case 0xe322:
      case 0xe323:
      case 0xe325:
      case 0xe327:
      case 0xe328:
      case 0xe329:
      case 0xe32b:
      case 0xe32c:
      case 0xe32d:
      case 0xe32e:
      case 0xe333:
      case 0xe335:
      case 0xe337:
      case 0xe338:
      case 0xe339:
      case 0xe33b:
      case 0xe33c:
      case 0xe33d:
      case 0xe340:
      case 0xe341:
      case 0xe342:
      case 0xe343:
      case 0xe344:
      case 0xe345:
      case 0xe347:
      case 0xe348:
      case 0xe349:
      case 0xe34a:
      case 0xe34b:
      case 0xe34c:
      case 0xe34d:
      case 0xe34e:
      case 0xe34f:
      case 0xe352:
      case 0xe353:
      case 0xe35d:
      case 0xe360:
      case 0xe361:
      case 0xe362:
      case 0xe363:
      case 0xe364:
      case 0xe365:
      case 0xe366:
      case 0xe367:
      case 0xe368:
      case 0xe369:
      case 0xe36a:
      case 0xe36b:
      case 0xe36c:
      case 0xe36d:
      case 0xe36e:
      case 0xe36f:
      case 0xe374:
      case 0xe37d:
      case 0xe37e:
      case 0xe37f:
      case 0xe383:
      case 0xe384:
      case 0xe38a:
      case 0xe38b:
      case 0xe38c:
      case 0xe38d:
      case 0xe392:
      case 0xe393:
      case 0xe39a:
      case 0xe39b:
      case 0xe39e:
      case 0xe3a0:
      case 0xe3a1:
      case 0xe3a2:
      case 0xe3a3:
      case 0xe3a4:
      case 0xe3a5:
      case 0xe3a6:
      case 0xe3a7:
      case 0xe3a8:
      case 0xe3a9:
      case 0xe3aa:
      case 0xe3ab:
      case 0xe3ac:
      case 0xe3ad:
      case 0xe3ae:
      case 0xe3af:
      case 0xe3b0:
      case 0xe3b1:
      case 0xe3b2:
      case 0xe3b3:
      case 0xe3b4:
      case 0xe3b5:
      case 0xe3b6:
      case 0xe3b7:
      case 0xe3b8:
      case 0xe3b9:
      case 0xe3ba:
      case 0xe3bb:
      case 0xe3bc:
      case 0xe3bd:
      case 0xe3be:
      case 0xe3bf:
      case 0xe3c1:
      case 0xe3c5:
      case 0xe3c9:
      case 0xe3cc:
      case 0xe3ce:
      case 0xe3d1:
      case 0xe3d2:
      case 0xe3d3:
      case 0xe3d5:
      case 0xe3d6:
      case 0xe3d7:
      case 0xe3d8:
      case 0xe3d9:
      case 0xe3da:
      case 0xe3db:
      case 0xe3dc:
      case 0xe3dd:
      case 0xe3de:
      case 0xe3df:
      case 0xe3e0:
      case 0xe3e1:
      case 0xe3e2:
      case 0xe3e3:
      case 0xe3e4:
      case 0xe3e5:
      case 0xe3e6:
      case 0xe3e7:
      case 0xe3e8:
      case 0xe3e9:
      case 0xe3ea:
        goto switchD_00ae616d_caseD_eb7b;
      case 0xe308:
        local_c8 = insn_info + 7;
        break;
      case 0xe309:
        local_c8 = insn_info + 0x251;
        break;
      case 0xe30a:
        local_c8 = insn_info + 0x22;
        break;
      case 0xe30b:
        local_c8 = insn_info + 0x263;
        break;
      case 0xe30c:
        local_c8 = insn_info + 0x1d7;
        break;
      case 0xe30d:
        local_c8 = insn_info + 0xf1;
        break;
      case 0xe30f:
        local_c8 = insn_info + 0x194;
        break;
      case 0xe312:
        local_c8 = insn_info + 0x137;
        break;
      case 0xe313:
        local_c8 = insn_info + 0x329;
        break;
      case 0xe314:
        local_c8 = insn_info + 0x119;
        break;
      case 0xe315:
        local_c8 = insn_info + 0x153;
        break;
      case 0xe316:
        local_c8 = insn_info + 0x15c;
        break;
      case 0xe317:
        local_c8 = insn_info + 0x172;
        break;
      case 0xe318:
        local_c8 = insn_info + 8;
        break;
      case 0xe319:
        local_c8 = insn_info + 0x252;
        break;
      case 0xe31a:
        local_c8 = insn_info + 0x23;
        break;
      case 0xe31b:
        local_c8 = insn_info + 0x264;
        break;
      case 0xe31c:
        local_c8 = insn_info + 0x1d8;
        break;
      case 0xe31d:
        local_c8 = insn_info + 0xf2;
        break;
      case 0xe31e:
        local_c8 = insn_info + 0x193;
        break;
      case 0xe31f:
        local_c8 = insn_info + 0x192;
        break;
      case 0xe320:
        local_c8 = insn_info + 0x65;
        break;
      case 0xe321:
        local_c8 = insn_info + 0x89;
        break;
      case 0xe324:
        local_c8 = insn_info + 0x226;
        break;
      case 0xe326:
        local_c8 = insn_info + 0xc5;
        break;
      case 0xe32a:
        local_c8 = insn_info + 0x140;
        break;
      case 0xe32f:
        local_c8 = insn_info + 0x23d;
        break;
      case 0xe330:
        local_c8 = insn_info + 0x66;
        break;
      case 0xe331:
        local_c8 = insn_info + 0x8a;
        break;
      case 0xe332:
        local_c8 = insn_info + 0x139;
        break;
      case 0xe334:
        local_c8 = insn_info + 0x78;
        break;
      case 0xe336:
        local_c8 = insn_info + 0x1f6;
        break;
      case 0xe33a:
        local_c8 = insn_info + 0x141;
        break;
      case 0xe33e:
        local_c8 = insn_info + 0x23c;
        break;
      case 0xe33f:
        local_c8 = insn_info + 0x23b;
        break;
      case 0xe346:
        local_c8 = insn_info + 0x4f;
        break;
      case 0xe350:
        local_c8 = insn_info + 0x225;
        break;
      case 0xe351:
        local_c8 = insn_info + 0x1d4;
        break;
      case 0xe354:
        local_c8 = insn_info + 0x35;
        break;
      case 0xe355:
        local_c8 = insn_info + 0x86;
        break;
      case 0xe356:
        local_c8 = insn_info + 0x1e6;
        break;
      case 0xe357:
        local_c8 = insn_info + 0xf6;
        break;
      case 0xe358:
        local_c8 = insn_info + 0x115;
        break;
      case 0xe359:
        local_c8 = insn_info + 0x62;
        break;
      case 0xe35a:
        local_c8 = insn_info + 3;
        break;
      case 0xe35b:
        local_c8 = insn_info + 0x24d;
        break;
      case 0xe35c:
        local_c8 = insn_info + 0x1c0;
        break;
      case 0xe35e:
        local_c8 = insn_info + 0x1e;
        break;
      case 0xe35f:
        local_c8 = insn_info + 0x25f;
        break;
      case 0xe370:
        local_c8 = insn_info + 0x234;
        break;
      case 0xe371:
        local_c8 = insn_info + 0x126;
        break;
      case 0xe372:
        local_c8 = insn_info + 0x22e;
        break;
      case 0xe373:
        local_c8 = insn_info + 0x108;
        break;
      case 0xe375:
        local_c8 = insn_info + 0x128;
        break;
      case 0xe376:
        local_c8 = insn_info + 0x144;
        break;
      case 0xe377:
        local_c8 = insn_info + 0x145;
        break;
      case 0xe378:
        local_c8 = insn_info + 0x152;
        break;
      case 0xe379:
        local_c8 = insn_info + 0x77;
        break;
      case 0xe37a:
        local_c8 = insn_info + 0x18;
        break;
      case 0xe37b:
        local_c8 = insn_info + 0x259;
        break;
      case 0xe37c:
        local_c8 = insn_info + 0x1cb;
        break;
      case 0xe380:
        local_c8 = insn_info + 0x38;
        break;
      case 0xe381:
        local_c8 = insn_info + 0x1e9;
        break;
      case 0xe382:
        local_c8 = insn_info + 0xf9;
        break;
      case 0xe385:
        local_c8 = insn_info + 0x13e;
        break;
      case 0xe386:
        local_c8 = insn_info + 0x1d1;
        break;
      case 0xe387:
        local_c8 = insn_info + 0xee;
        break;
      case 0xe388:
        local_c8 = insn_info + 0x31;
        break;
      case 0xe389:
        local_c8 = insn_info + 0x26c;
        break;
      case 0xe38e:
        local_c8 = insn_info + 0x249;
        break;
      case 0xe38f:
        local_c8 = insn_info + 0x188;
        break;
      case 0xe390:
        local_c8 = insn_info + 0x162;
        break;
      case 0xe391:
        local_c8 = insn_info + 0x167;
        break;
      case 0xe394:
        local_c8 = insn_info + 0x161;
        break;
      case 0xe395:
        local_c8 = insn_info + 0x166;
        break;
      case 0xe396:
        local_c8 = insn_info + 0x1cf;
        break;
      case 0xe397:
        local_c8 = insn_info + 0xec;
        break;
      case 0xe398:
        local_c8 = insn_info + 0x30;
        break;
      case 0xe399:
        local_c8 = insn_info + 0x26b;
        break;
      case 0xe39c:
        local_c8 = insn_info + 0x173;
        break;
      case 0xe39d:
        local_c8 = insn_info + 0x15d;
        break;
      case 0xe39f:
        local_c8 = insn_info + 0x13d;
        break;
      case 0xe3c0:
        local_c8 = insn_info + 0x146;
        break;
      case 0xe3c2:
        local_c8 = insn_info + 0x163;
        break;
      case 0xe3c3:
        local_c8 = insn_info + 0x22f;
        break;
      case 0xe3c4:
        local_c8 = insn_info + 0x154;
        break;
      case 0xe3c6:
        local_c8 = insn_info + 0x168;
        break;
      case 0xe3c7:
        local_c8 = insn_info + 0x235;
        break;
      case 0xe3c8:
        local_c8 = insn_info + 0x15a;
        break;
      case 0xe3ca:
        local_c8 = insn_info + 0x159;
        break;
      case 0xe3cb:
        local_c8 = insn_info + 0x237;
        break;
      case 0xe3cd:
        local_c8 = insn_info + 0x82;
        break;
      case 0xe3cf:
        local_c8 = insn_info + 0x8e;
        break;
      case 0xe3d0:
        local_c8 = insn_info + 0x361;
        break;
      case 0xe3d4:
        local_c8 = insn_info + 0x362;
        break;
      case 0xe3eb:
        local_c8 = insn_info + 0x13f;
        break;
      default:
        switch(uVar6) {
        case 0xb2fa:
          local_c8 = insn_info + 0x5d;
          break;
        case 0xb2fb:
        case 0xb2fc:
        case 0xb2fd:
        case 0xb2fe:
        case 0xb2ff:
        case 0xb320:
        case 0xb321:
        case 0xb322:
        case 0xb323:
        case 0xb325:
        case 0xb326:
        case 0xb327:
        case 0xb328:
        case 0xb329:
        case 0xb32a:
        case 0xb32b:
        case 0xb32c:
        case 0xb32d:
        case 0xb32e:
        case 0xb32f:
        case 0xb330:
        case 0xb331:
        case 0xb332:
        case 0xb333:
        case 0xb334:
        case 0xb335:
        case 0xb336:
        case 0xb337:
        case 0xb338:
        case 0xb339:
        case 0xb33a:
        case 0xb33b:
        case 0xb33c:
        case 0xb33d:
        case 0xb33e:
        case 0xb33f:
        case 0xb34e:
        case 0xb34f:
        case 0xb350:
        case 0xb351:
        case 0xb352:
        case 0xb353:
        case 0xb354:
        case 0xb355:
        case 0xb356:
        case 0xb358:
        case 0xb359:
        case 0xb35a:
        case 0xb35b:
        case 0xb35c:
        case 0xb35d:
        case 0xb35e:
        case 0xb360:
        case 0xb361:
        case 0xb362:
        case 0xb363:
        case 0xb364:
        case 0xb366:
        case 0xb367:
        case 0xb368:
        case 0xb369:
        case 0xb36a:
        case 0xb36b:
        case 0xb36c:
        case 0xb36d:
        case 0xb36e:
        case 0xb36f:
        case 0xb377:
        case 0xb378:
        case 0xb379:
        case 0xb37a:
        case 0xb37b:
        case 0xb37c:
        case 0xb37d:
        case 0xb37e:
        case 0xb37f:
        case 0xb380:
        case 0xb381:
        case 0xb382:
        case 0xb383:
        case 0xb386:
        case 0xb387:
        case 0xb388:
        case 0xb389:
        case 0xb38a:
        case 0xb38b:
        case 0xb38d:
        case 0xb38e:
        case 0xb38f:
        case 0xb393:
        case 0xb397:
        case 0xb39b:
        case 0xb39f:
        case 0xb3a3:
        case 0xb3a7:
        case 0xb3ab:
        case 45999:
        case 46000:
        case 0xb3b1:
        case 0xb3b2:
        case 0xb3b3:
        case 0xb3b4:
        case 0xb3b5:
        case 0xb3b6:
        case 0xb3b7:
        case 0xb3b8:
        case 0xb3b9:
        case 0xb3ba:
        case 0xb3bb:
        case 0xb3bc:
        case 0xb3bd:
        case 0xb3be:
        case 0xb3bf:
        case 0xb3c0:
        case 0xb3c2:
        case 0xb3c3:
        case 0xb3c4:
        case 0xb3c5:
        case 0xb3c6:
        case 0xb3c7:
        case 0xb3c8:
        case 0xb3c9:
        case 0xb3ca:
        case 0xb3cb:
        case 0xb3cc:
          goto switchD_00ae616d_caseD_eb7b;
        case 0xb300:
          local_c8 = insn_info + 0x18c;
          break;
        case 0xb301:
          local_c8 = insn_info + 0x179;
          break;
        case 0xb302:
          local_c8 = insn_info + 0x13a;
          break;
        case 0xb303:
          local_c8 = insn_info + 0x14a;
          break;
        case 0xb304:
          local_c8 = insn_info + 0x19d;
          break;
        case 0xb305:
          local_c8 = insn_info + 0x19e;
          break;
        case 0xb306:
          local_c8 = insn_info + 0x19f;
          break;
        case 0xb307:
          local_c8 = insn_info + 0x1c5;
          break;
        case 0xb308:
          local_c8 = insn_info + 0x6c;
          break;
        case 0xb309:
          local_c8 = insn_info + 0x67;
          break;
        case 0xb30a:
          local_c8 = insn_info + 9;
          break;
        case 0xb30b:
          local_c8 = insn_info + 0x253;
          break;
        case 0xb30c:
          local_c8 = insn_info + 0x1c4;
          break;
        case 0xb30d:
          local_c8 = insn_info + 0xe6;
          break;
        case 0xb30e:
          local_c8 = insn_info + 0x1db;
          break;
        case 0xb30f:
          local_c8 = insn_info + 0x1df;
          break;
        case 0xb310:
          local_c8 = insn_info + 0x18d;
          break;
        case 0xb311:
          local_c8 = insn_info + 0x17a;
          break;
        case 0xb312:
          local_c8 = insn_info + 0x13b;
          break;
        case 0xb313:
          local_c8 = insn_info + 0x14b;
          break;
        case 0xb314:
          local_c8 = insn_info + 0x21f;
          break;
        case 0xb315:
          local_c8 = insn_info + 0x220;
          break;
        case 0xb316:
          local_c8 = insn_info + 0x221;
          break;
        case 0xb317:
          local_c8 = insn_info + 0x1c1;
          break;
        case 0xb318:
          local_c8 = insn_info + 0x6d;
          break;
        case 0xb319:
          local_c8 = insn_info + 0x68;
          break;
        case 0xb31a:
          local_c8 = insn_info + 10;
          break;
        case 0xb31b:
          local_c8 = insn_info + 0x254;
          break;
        case 0xb31c:
          local_c8 = insn_info + 0x1c2;
          break;
        case 0xb31d:
          local_c8 = insn_info + 0xe7;
          break;
        case 0xb31e:
          local_c8 = insn_info + 0x1dc;
          break;
        case 0xb31f:
          local_c8 = insn_info + 0x1e0;
          break;
        case 0xb324:
          local_c8 = insn_info + 0x1a3;
          break;
        case 0xb340:
          local_c8 = insn_info + 0x18e;
          break;
        case 0xb341:
          local_c8 = insn_info + 0x17b;
          break;
        case 0xb342:
          local_c8 = insn_info + 0x13c;
          break;
        case 0xb343:
          local_c8 = insn_info + 0x14c;
          break;
        case 0xb344:
          local_c8 = insn_info + 0x1a5;
          break;
        case 0xb345:
          local_c8 = insn_info + 0x1a6;
          break;
        case 0xb346:
          local_c8 = insn_info + 0x1a7;
          break;
        case 0xb347:
          local_c8 = insn_info + 0x19c;
          break;
        case 0xb348:
          local_c8 = insn_info + 0x6e;
          break;
        case 0xb349:
          local_c8 = insn_info + 0x69;
          break;
        case 0xb34a:
          local_c8 = insn_info + 0xb;
          break;
        case 0xb34b:
          local_c8 = insn_info + 0x255;
          break;
        case 0xb34c:
          local_c8 = insn_info + 0x1c3;
          break;
        case 0xb34d:
          local_c8 = insn_info + 0xe8;
          break;
        case 0xb357:
          local_c8 = insn_info + 0x19a;
          break;
        case 0xb35f:
          local_c8 = insn_info + 0x19b;
          break;
        case 0xb365:
          local_c8 = insn_info + 0x120;
          break;
        case 0xb370:
          local_c8 = insn_info + 399;
          break;
        case 0xb371:
          local_c8 = insn_info + 0x17c;
          break;
        case 0xb372:
          local_c8 = insn_info + 0x5f;
          break;
        case 0xb373:
          local_c8 = insn_info + 0x14d;
          break;
        case 0xb374:
          local_c8 = insn_info + 0x195;
          break;
        case 0xb375:
          local_c8 = insn_info + 0x196;
          break;
        case 0xb376:
          local_c8 = insn_info + 0x197;
          break;
        case 0xb384:
          local_c8 = insn_info + 0x209;
          break;
        case 0xb385:
          local_c8 = insn_info + 0x20a;
          break;
        case 0xb38c:
          local_c8 = insn_info + 0x104;
          break;
        case 0xb390:
          local_c8 = insn_info + 0xd8;
          break;
        case 0xb391:
          local_c8 = insn_info + 0xd9;
          break;
        case 0xb392:
          local_c8 = insn_info + 0xda;
          break;
        case 0xb394:
          local_c8 = insn_info + 0xcc;
          break;
        case 0xb395:
          local_c8 = insn_info + 0xcd;
          break;
        case 0xb396:
          local_c8 = insn_info + 0xce;
          break;
        case 0xb398:
          local_c8 = insn_info + 0xc6;
          break;
        case 0xb399:
          local_c8 = insn_info + 199;
          break;
        case 0xb39a:
          local_c8 = insn_info + 200;
          break;
        case 0xb39c:
          local_c8 = insn_info + 0xd2;
          break;
        case 0xb39d:
          local_c8 = insn_info + 0xd3;
          break;
        case 0xb39e:
          local_c8 = insn_info + 0xd4;
          break;
        case 0xb3a0:
          local_c8 = insn_info + 0xdb;
          break;
        case 0xb3a1:
          local_c8 = insn_info + 0xdc;
          break;
        case 0xb3a2:
          local_c8 = insn_info + 0xdd;
          break;
        case 0xb3a4:
          local_c8 = insn_info + 0xcf;
          break;
        case 0xb3a5:
          local_c8 = insn_info + 0xd0;
          break;
        case 0xb3a6:
          local_c8 = insn_info + 0xd1;
          break;
        case 0xb3a8:
          local_c8 = insn_info + 0xc9;
          break;
        case 0xb3a9:
          local_c8 = insn_info + 0xca;
          break;
        case 0xb3aa:
          local_c8 = insn_info + 0xcb;
          break;
        case 0xb3ac:
          local_c8 = insn_info + 0xd5;
          break;
        case 0xb3ad:
          local_c8 = insn_info + 0xd6;
          break;
        case 0xb3ae:
          local_c8 = insn_info + 0xd7;
          break;
        case 0xb3c1:
          local_c8 = insn_info + 0x174;
          break;
        case 0xb3cd:
          local_c8 = insn_info + 0x175;
          break;
        default:
          switch(uVar6) {
          case 0xb202:
            local_c8 = insn_info + 0x340;
            break;
          case 0xb203:
          case 0xb20b:
          case 0xb20c:
          case 0xb20e:
          case 0xb20f:
          case 0xb213:
          case 0xb214:
          case 0xb215:
          case 0xb216:
          case 0xb217:
          case 0xb218:
          case 0xb219:
          case 0xb21a:
          case 0xb21b:
          case 0xb21c:
          case 0xb21d:
          case 0xb21e:
          case 0xb21f:
          case 0xb223:
          case 0xb224:
          case 0xb225:
          case 0xb226:
          case 0xb227:
          case 0xb228:
          case 0xb22d:
          case 0xb22e:
          case 0xb22f:
          case 0xb23d:
          case 0xb23e:
          case 0xb23f:
          case 0xb240:
          case 0xb242:
          case 0xb243:
          case 0xb244:
          case 0xb245:
          case 0xb247:
          case 0xb248:
          case 0xb249:
          case 0xb24a:
          case 0xb24c:
          case 0xb24d:
          case 0xb251:
          case 0xb253:
          case 0xb256:
          case 0xb257:
          case 0xb258:
          case 0xb259:
          case 0xb25a:
          case 0xb25b:
          case 0xb25c:
          case 0xb260:
          case 0xb261:
          case 0xb262:
          case 0xb263:
          case 0xb264:
          case 0xb265:
          case 0xb266:
          case 0xb267:
          case 0xb268:
          case 0xb269:
          case 0xb26a:
          case 0xb26b:
          case 0xb26c:
          case 0xb26d:
          case 0xb26e:
          case 0xb26f:
          case 0xb270:
          case 0xb271:
          case 0xb272:
          case 0xb273:
          case 0xb275:
          case 0xb277:
          case 0xb27a:
          case 0xb27b:
          case 0xb27e:
          case 0xb27f:
            goto switchD_00ae616d_caseD_eb7b;
          case 0xb204:
            local_c8 = insn_info + 0x333;
            break;
          case 0xb205:
            local_c8 = insn_info + 0x23e;
            break;
          case 0xb206:
            local_c8 = insn_info + 0x334;
            break;
          case 0xb207:
            local_c8 = insn_info + 0x33c;
            break;
          case 0xb208:
            local_c8 = insn_info + 0x336;
            break;
          case 0xb209:
            local_c8 = insn_info + 0x341;
            break;
          case 0xb20a:
            local_c8 = insn_info + 0x338;
            break;
          case 0xb20d:
            local_c8 = insn_info + 0x32f;
            break;
          case 0xb210:
            local_c8 = insn_info + 0x337;
            break;
          case 0xb211:
            local_c8 = insn_info + 0x343;
            break;
          case 0xb212:
            local_c8 = insn_info + 0x33f;
            break;
          case 0xb220:
            local_c8 = insn_info + 0x331;
            break;
          case 0xb221:
            local_c8 = insn_info + 0x322;
            break;
          case 0xb222:
            local_c8 = insn_info + 0x112;
            break;
          case 0xb229:
            local_c8 = insn_info + 800;
            break;
          case 0xb22a:
            local_c8 = insn_info + 0x330;
            break;
          case 0xb22b:
            local_c8 = insn_info + 0x339;
            break;
          case 0xb22c:
            local_c8 = insn_info + 0x349;
            break;
          case 0xb230:
            local_c8 = insn_info + 0x34c;
            break;
          case 0xb231:
            local_c8 = insn_info + 0x34d;
            break;
          case 0xb232:
            local_c8 = insn_info + 0x34e;
            break;
          case 0xb233:
            local_c8 = insn_info + 0x355;
            break;
          case 0xb234:
            local_c8 = insn_info + 0x357;
            break;
          case 0xb235:
            local_c8 = insn_info + 0x359;
            break;
          case 0xb236:
            local_c8 = insn_info + 0x358;
            break;
          case 0xb237:
            local_c8 = insn_info + 0x351;
            break;
          case 0xb238:
            local_c8 = insn_info + 0x350;
            break;
          case 0xb239:
            local_c8 = insn_info + 0x356;
            break;
          case 0xb23a:
            local_c8 = insn_info + 0x354;
            break;
          case 0xb23b:
            local_c8 = insn_info + 0x34f;
            break;
          case 0xb23c:
            local_c8 = insn_info + 0x352;
            break;
          case 0xb241:
            local_c8 = insn_info + 0x5e;
            break;
          case 0xb246:
            local_c8 = insn_info + 0x347;
            break;
          case 0xb24b:
            local_c8 = insn_info + 0x32b;
            break;
          case 0xb24e:
            local_c8 = insn_info + 0x205;
            break;
          case 0xb24f:
            local_c8 = insn_info + 0x101;
            break;
          case 0xb250:
            local_c8 = insn_info + 0x31d;
            break;
          case 0xb252:
            local_c8 = insn_info + 0x1d2;
            break;
          case 0xb254:
            local_c8 = insn_info + 0x1b9;
            break;
          case 0xb255:
            local_c8 = insn_info + 0x1ba;
            break;
          case 0xb25d:
            local_c8 = insn_info + 0xa2;
            break;
          case 0xb25e:
            local_c8 = insn_info + 0x203;
            break;
          case 0xb25f:
            local_c8 = insn_info + 0x35a;
            break;
          case 0xb274:
            local_c8 = insn_info + 0x353;
            break;
          case 0xb276:
            local_c8 = insn_info + 0x34b;
            break;
          case 0xb278:
            local_c8 = insn_info + 0x240;
            break;
          case 0xb279:
            local_c8 = insn_info + 0x332;
            break;
          case 0xb27c:
            local_c8 = insn_info + 0x23f;
            break;
          case 0xb27d:
            local_c8 = insn_info + 0x344;
            break;
          case 0xb280:
            local_c8 = insn_info + 0x325;
            break;
          default:
            switch(uVar6) {
            case 0xecd8:
              local_c8 = insn_info + 0x12;
              break;
            case 0xecd9:
              local_c8 = insn_info + 0x15;
              break;
            case 0xecda:
              local_c8 = insn_info + 0x29;
              break;
            case 0xecdb:
              local_c8 = insn_info + 0x2b;
              break;
            case 0xecdc:
            case 0xecdd:
            case 0xecde:
            case 0xecdf:
            case 0xece0:
            case 0xece1:
            case 0xece2:
            case 0xece3:
            case 0xece6:
            case 0xece7:
            case 0xece8:
            case 0xece9:
            case 0xecea:
            case 0xeceb:
            case 0xecec:
            case 0xeced:
            case 0xecee:
            case 0xecef:
            case 0xecf0:
            case 0xecf1:
            case 0xecf2:
            case 0xecf3:
            case 0xecf4:
            case 0xecf5:
            case 0xecf8:
            case 0xecf9:
            case 0xecfa:
            case 0xecfb:
            case 0xed00:
            case 0xed01:
            case 0xed02:
            case 0xed03:
            case 0xed13:
            case 0xed16:
            case 0xed20:
            case 0xed21:
            case 0xed22:
            case 0xed23:
              goto switchD_00ae616d_caseD_eb7b;
            case 0xece4:
              local_c8 = insn_info + 0xa4;
              break;
            case 0xece5:
              local_c8 = insn_info + 0xac;
              break;
            case 0xecf6:
              local_c8 = insn_info + 0xa3;
              break;
            case 0xecf7:
              local_c8 = insn_info + 0xab;
              break;
            case 0xecfc:
              local_c8 = insn_info + 0xa8;
              break;
            case 0xecfd:
              local_c8 = insn_info + 0xb0;
              break;
            case 0xecfe:
              local_c8 = insn_info + 0xa7;
              break;
            case 0xecff:
              local_c8 = insn_info + 0xaf;
              break;
            case 0xed04:
              local_c8 = insn_info + 0x1a0;
              break;
            case 0xed05:
              local_c8 = insn_info + 0x1a1;
              break;
            case 0xed06:
              local_c8 = insn_info + 0x1a2;
              break;
            case 0xed07:
              local_c8 = insn_info + 0x1c9;
              break;
            case 0xed08:
              local_c8 = insn_info + 0x6f;
              break;
            case 0xed09:
              local_c8 = insn_info + 0x6a;
              break;
            case 0xed0a:
              local_c8 = insn_info + 0xc;
              break;
            case 0xed0b:
              local_c8 = insn_info + 0x256;
              break;
            case 0xed0c:
              local_c8 = insn_info + 0x1c8;
              break;
            case 0xed0d:
              local_c8 = insn_info + 0xe9;
              break;
            case 0xed0e:
              local_c8 = insn_info + 0x1dd;
              break;
            case 0xed0f:
              local_c8 = insn_info + 0x1e1;
              break;
            case 0xed10:
              local_c8 = insn_info + 0x270;
              break;
            case 0xed11:
              local_c8 = insn_info + 0x271;
              break;
            case 0xed12:
              local_c8 = insn_info + 0x272;
              break;
            case 0xed14:
              local_c8 = insn_info + 0x222;
              break;
            case 0xed15:
              local_c8 = insn_info + 0x223;
              break;
            case 0xed17:
              local_c8 = insn_info + 0x1c6;
              break;
            case 0xed18:
              local_c8 = insn_info + 0x70;
              break;
            case 0xed19:
              local_c8 = insn_info + 0x6b;
              break;
            case 0xed1a:
              local_c8 = insn_info + 0xd;
              break;
            case 0xed1b:
              local_c8 = insn_info + 599;
              break;
            case 0xed1c:
              local_c8 = insn_info + 0x1c7;
              break;
            case 0xed1d:
              local_c8 = insn_info + 0xea;
              break;
            case 0xed1e:
              local_c8 = insn_info + 0x1de;
              break;
            case 0xed1f:
              local_c8 = insn_info + 0x1e2;
              break;
            case 0xed24:
              local_c8 = insn_info + 0x1a4;
              break;
            default:
              switch(uVar6) {
              case 0xeb1c:
                local_c8 = insn_info + 0x1fb;
                break;
              case 0xeb1d:
                local_c8 = insn_info + 0x1fa;
                break;
              case 0xeb1e:
              case 0xeb1f:
              case 0xeb22:
              case 0xeb27:
              case 0xeb28:
              case 0xeb29:
              case 0xeb2a:
              case 0xeb2e:
              case 0xeb32:
              case 0xeb33:
              case 0xeb34:
              case 0xeb35:
              case 0xeb36:
              case 0xeb37:
              case 0xeb38:
              case 0xeb39:
              case 0xeb3a:
              case 0xeb3b:
              case 0xeb3c:
              case 0xeb3d:
              case 0xeb3f:
              case 0xeb40:
              case 0xeb41:
              case 0xeb42:
              case 0xeb43:
              case 0xeb46:
              case 0xeb47:
              case 0xeb48:
              case 0xeb49:
              case 0xeb4a:
              case 0xeb4b:
              case 0xeb4d:
              case 0xeb4e:
              case 0xeb4f:
              case 0xeb50:
              case 0xeb53:
                goto switchD_00ae616d_caseD_eb7b;
              case 0xeb20:
                local_c8 = insn_info + 0xa1;
                break;
              case 0xeb21:
                local_c8 = insn_info + 0xa0;
                break;
              case 0xeb23:
                local_c8 = insn_info + 0xc0;
                break;
              case 0xeb24:
                local_c8 = insn_info + 0x245;
                break;
              case 0xeb25:
                local_c8 = insn_info + 0x33e;
                break;
              case 0xeb26:
                local_c8 = insn_info + 0x246;
                break;
              case 0xeb2b:
                local_c8 = insn_info + 0xc1;
                break;
              case 0xeb2c:
                local_c8 = insn_info + 0x232;
                break;
              case 0xeb2d:
                local_c8 = insn_info + 0x231;
                break;
              case 0xeb2f:
                local_c8 = insn_info + 0x324;
                break;
              case 0xeb30:
                local_c8 = insn_info + 0xb5;
                break;
              case 0xeb31:
                local_c8 = insn_info + 0xb7;
                break;
              case 0xeb3e:
                local_c8 = insn_info + 0xb8;
                break;
              case 0xeb44:
                local_c8 = insn_info + 0x55;
                break;
              case 0xeb45:
                local_c8 = insn_info + 0x56;
                break;
              case 0xeb4c:
                local_c8 = insn_info + 0x102;
                break;
              case 0xeb51:
                local_c8 = insn_info + 0x275;
                break;
              case 0xeb52:
                local_c8 = insn_info + 0x1b3;
                break;
              case 0xeb54:
                local_c8 = insn_info + 0x41;
                break;
              case 0xeb55:
                local_c8 = insn_info + 0x92;
                break;
              case 0xeb56:
                local_c8 = insn_info + 0x1f2;
                break;
              case 0xeb57:
                local_c8 = insn_info + 0xfe;
                break;
              default:
                switch(uVar6) {
                case 0xebd0:
                  local_c8 = insn_info + 0x35b;
                  break;
                case 0xebd1:
                  local_c8 = insn_info + 0x35c;
                  break;
                case 0xebd2:
                case 0xebd3:
                case 0xebd4:
                case 0xebd5:
                case 0xebd6:
                case 0xebd7:
                case 0xebd8:
                case 0xebd9:
                case 0xebda:
                case 0xebdb:
                case 0xebe5:
                case 0xebe9:
                case 0xebeb:
                case 0xebec:
                case 0xebed:
                case 0xebee:
                case 0xebef:
                case 0xebf0:
                case 0xebf1:
                case 0xebf5:
                case 0xebf9:
                  goto switchD_00ae616d_caseD_eb7b;
                case 0xebdc:
                  local_c8 = insn_info + 0x216;
                  break;
                case 0xebdd:
                  local_c8 = insn_info + 0x210;
                  break;
                case 0xebde:
                  local_c8 = insn_info + 0x219;
                  break;
                case 0xebdf:
                  local_c8 = insn_info + 0x213;
                  break;
                case 0xebe0:
                  local_c8 = insn_info + 0x185;
                  break;
                case 0xebe1:
                  local_c8 = insn_info + 0x23a;
                  break;
                case 0xebe2:
                  local_c8 = insn_info + 0x180;
                  break;
                case 0xebe3:
                  local_c8 = insn_info + 0x239;
                  break;
                case 0xebe4:
                  local_c8 = insn_info + 0x12f;
                  break;
                case 0xebe6:
                  local_c8 = insn_info + 0x133;
                  break;
                case 0xebe7:
                  local_c8 = insn_info + 0x131;
                  break;
                case 0xebe8:
                  local_c8 = insn_info + 299;
                  break;
                case 0xebea:
                  local_c8 = insn_info + 0x12d;
                  break;
                case 0xebf2:
                  local_c8 = insn_info + 0x17f;
                  break;
                case 0xebf3:
                  local_c8 = insn_info + 0x238;
                  break;
                case 0xebf4:
                  local_c8 = insn_info + 0x12e;
                  break;
                case 0xebf6:
                  local_c8 = insn_info + 0x132;
                  break;
                case 0xebf7:
                  local_c8 = insn_info + 0x130;
                  break;
                case 0xebf8:
                  local_c8 = insn_info + 0x12a;
                  break;
                case 0xebfa:
                  local_c8 = insn_info + 300;
                  break;
                default:
                  switch(uVar6) {
                  case 0xa500:
                    local_c8 = insn_info + 0x10e;
                    break;
                  case 0xa501:
                    local_c8 = insn_info + 0x10f;
                    break;
                  case 0xa502:
                    local_c8 = insn_info + 0x110;
                    break;
                  case 0xa503:
                    local_c8 = insn_info + 0x111;
                    break;
                  case 0xa504:
                    local_c8 = insn_info + 0x3c;
                    break;
                  case 0xa505:
                    local_c8 = insn_info + 0x3d;
                    break;
                  case 0xa506:
                    local_c8 = insn_info + 0x3e;
                    break;
                  case 0xa507:
                    local_c8 = insn_info + 0x3f;
                    break;
                  case 0xa508:
                    local_c8 = insn_info + 0x1ed;
                    break;
                  case 0xa509:
                    local_c8 = insn_info + 0x1ee;
                    break;
                  case 0xa50a:
                    local_c8 = insn_info + 0x1ef;
                    break;
                  case 0xa50b:
                    local_c8 = insn_info + 0x1f0;
                    break;
                  case 0xa50c:
                    local_c8 = insn_info + 0x16d;
                    break;
                  case 0xa50d:
                    local_c8 = insn_info + 0x16e;
                    break;
                  case 0xa50e:
                    local_c8 = insn_info + 0x16f;
                    break;
                  case 0xa50f:
                    local_c8 = insn_info + 0x170;
                    break;
                  default:
                    switch(uVar6) {
                    case 0xa700:
                      local_c8 = insn_info + 0x278;
                      break;
                    case 0xa701:
                      local_c8 = insn_info + 0x279;
                      break;
                    case 0xa702:
                      local_c8 = insn_info + 0x276;
                      break;
                    case 0xa703:
                      local_c8 = insn_info + 0x277;
                      break;
                    case 0xa704:
                      local_c8 = insn_info + 0x4a;
                      break;
                    case 0xa705:
                      local_c8 = insn_info + 0x46;
                      break;
                    case 0xa706:
                      local_c8 = insn_info + 0x50;
                      break;
                    case 0xa707:
                      local_c8 = insn_info + 0x51;
                      break;
                    case 0xa708:
                      local_c8 = insn_info + 0x155;
                      break;
                    case 0xa709:
                      local_c8 = insn_info + 0x156;
                      break;
                    case 0xa70a:
                      local_c8 = insn_info + 0x19;
                      break;
                    case 0xa70b:
                      local_c8 = insn_info + 0x1a;
                      break;
                    case 0xa70c:
                      local_c8 = insn_info + 0x1cc;
                      break;
                    case 0xa70d:
                      local_c8 = insn_info + 0x1cd;
                      break;
                    case 0xa70e:
                      local_c8 = insn_info + 0x79;
                      break;
                    case 0xa70f:
                      local_c8 = insn_info + 0x7a;
                      break;
                    default:
                      switch(uVar6) {
                      case 0xc000:
                        local_c8 = insn_info + 0x129;
                        break;
                      case 0xc001:
                        local_c8 = insn_info + 0x121;
                        break;
                      case 0xc002:
                      case 0xc003:
                        goto switchD_00ae616d_caseD_eb7b;
                      case 0xc004:
                        local_c8 = insn_info + 0x4b;
                        break;
                      case 0xc005:
                        local_c8 = insn_info + 0x47;
                        break;
                      case 0xc006:
                        local_c8 = insn_info + 0xfb;
                        break;
                      case 0xc007:
                        local_c8 = insn_info + 0xfc;
                        break;
                      case 0xc008:
                        local_c8 = insn_info + 0x10c;
                        break;
                      case 0xc009:
                        local_c8 = insn_info + 0x10d;
                        break;
                      case 0xc00a:
                        local_c8 = insn_info + 0x3a;
                        break;
                      case 0xc00b:
                        local_c8 = insn_info + 0x3b;
                        break;
                      case 0xc00c:
                        local_c8 = insn_info + 0x1eb;
                        break;
                      case 0xc00d:
                        local_c8 = insn_info + 0x1ec;
                        break;
                      case 0xc00e:
                        local_c8 = insn_info + 0x16b;
                        break;
                      case 0xc00f:
                        local_c8 = insn_info + 0x16c;
                        break;
                      default:
                        switch(uVar6) {
                        case 0xc200:
                          local_c8 = insn_info + 0x1da;
                          break;
                        case 0xc201:
                          local_c8 = insn_info + 0x1d9;
                          break;
                        case 0xc202:
                        case 0xc203:
                        case 0xc206:
                        case 0xc207:
                          goto switchD_00ae616d_caseD_eb7b;
                        case 0xc204:
                          local_c8 = insn_info + 0x268;
                          break;
                        case 0xc205:
                          local_c8 = insn_info + 0x267;
                          break;
                        case 0xc208:
                          local_c8 = insn_info + 0x13;
                          break;
                        case 0xc209:
                          local_c8 = insn_info + 0x10;
                          break;
                        case 0xc20a:
                          local_c8 = insn_info + 0x27;
                          break;
                        case 0xc20b:
                          local_c8 = insn_info + 0x26;
                          break;
                        case 0xc20c:
                          local_c8 = insn_info + 0x72;
                          break;
                        case 0xc20d:
                          local_c8 = insn_info + 0x71;
                          break;
                        case 0xc20e:
                          local_c8 = insn_info + 0x90;
                          break;
                        case 0xc20f:
                          local_c8 = insn_info + 0x8f;
                          break;
                        default:
                          switch(uVar6) {
                          case 0xc600:
                            local_c8 = insn_info + 0x100;
                            break;
                          case 0xc601:
                          case 0xc603:
                          case 0xc609:
                          case 0xc60b:
                            goto switchD_00ae616d_caseD_eb7b;
                          case 0xc602:
                            local_c8 = insn_info + 0x1f7;
                            break;
                          case 0xc604:
                            local_c8 = insn_info + 0x7f;
                            break;
                          case 0xc605:
                            local_c8 = insn_info + 0x7e;
                            break;
                          case 0xc606:
                            local_c8 = insn_info + 0x9b;
                            break;
                          case 0xc607:
                            local_c8 = insn_info + 0x9a;
                            break;
                          case 0xc608:
                            local_c8 = insn_info + 0x74;
                            break;
                          case 0xc60a:
                            local_c8 = insn_info + 0x98;
                            break;
                          case 0xc60c:
                            local_c8 = insn_info + 0x75;
                            break;
                          case 0xc60d:
                            local_c8 = insn_info + 0x73;
                            break;
                          case 0xc60e:
                            local_c8 = insn_info + 0x99;
                            break;
                          case 0xc60f:
                            local_c8 = insn_info + 0x97;
                            break;
                          default:
                            switch(uVar6) {
                            case 0xec42:
                              local_c8 = insn_info + 0x181;
                              break;
                            case 0xec43:
                            case 0xec47:
                            case 0xec48:
                            case 0xec49:
                            case 0xec4a:
                            case 0xec4b:
                            case 0xec4c:
                            case 0xec4d:
                            case 0xec4f:
                            case 0xec50:
                            case 0xec52:
                            case 0xec53:
                            case 0xec58:
                            case 0xec5a:
                            case 0xec5b:
                            case 0xec5c:
                              goto switchD_00ae616d_caseD_eb7b;
                            case 0xec44:
                              local_c8 = insn_info + 0x59;
                              break;
                            case 0xec45:
                              local_c8 = insn_info + 0x5a;
                              break;
                            case 0xec46:
                              local_c8 = insn_info + 0x182;
                              break;
                            case 0xec4e:
                              local_c8 = insn_info + 0x183;
                              break;
                            case 0xec51:
                              local_c8 = insn_info + 0x1ff;
                              break;
                            case 0xec54:
                              local_c8 = insn_info + 0x200;
                              break;
                            case 0xec55:
                              local_c8 = insn_info + 0x1fc;
                              break;
                            case 0xec56:
                              local_c8 = insn_info + 0x201;
                              break;
                            case 0xec57:
                              local_c8 = insn_info + 0x202;
                              break;
                            case 0xec59:
                              local_c8 = insn_info + 0x1fd;
                              break;
                            case 0xec5d:
                              local_c8 = insn_info + 0x1fe;
                              break;
                            default:
                              switch(uVar6) {
                              case 0xec64:
                                local_c8 = insn_info + 0xa6;
                                break;
                              case 0xec65:
                                local_c8 = insn_info + 0xae;
                                break;
                              case 0xec66:
                              case 0xec67:
                              case 0xec68:
                              case 0xec69:
                              case 0xec6a:
                              case 0xec6b:
                              case 0xec6c:
                              case 0xec6d:
                              case 0xec6e:
                              case 0xec6f:
                              case 0xec74:
                              case 0xec75:
                              case 0xec78:
                              case 0xec79:
                              case 0xec7a:
                              case 0xec7b:
                                goto switchD_00ae616d_caseD_eb7b;
                              case 0xec70:
                                local_c8 = insn_info + 0xbd;
                                break;
                              case 0xec71:
                                local_c8 = insn_info + 0xc3;
                                break;
                              case 0xec72:
                                local_c8 = insn_info + 0xbc;
                                break;
                              case 0xec73:
                                local_c8 = insn_info + 0xc2;
                                break;
                              case 0xec76:
                                local_c8 = insn_info + 0xa5;
                                break;
                              case 0xec77:
                                local_c8 = insn_info + 0xad;
                                break;
                              case 0xec7c:
                                local_c8 = insn_info + 0xaa;
                                break;
                              case 0xec7d:
                                local_c8 = insn_info + 0xb2;
                                break;
                              case 0xec7e:
                                local_c8 = insn_info + 0xa9;
                                break;
                              case 0xec7f:
                                local_c8 = insn_info + 0xb1;
                                break;
                              default:
                                switch(uVar6) {
                                case 0xc402:
                                  local_c8 = insn_info + 0x169;
                                  break;
                                case 0xc403:
                                case 0xc409:
                                case 0xc40a:
                                  goto switchD_00ae616d_caseD_eb7b;
                                case 0xc404:
                                  local_c8 = insn_info + 0x158;
                                  break;
                                case 0xc405:
                                  local_c8 = insn_info + 0x157;
                                  break;
                                case 0xc406:
                                  local_c8 = insn_info + 0x16a;
                                  break;
                                case 0xc407:
                                  local_c8 = insn_info + 0x236;
                                  break;
                                case 0xc408:
                                  local_c8 = insn_info + 0x123;
                                  break;
                                case 0xc40b:
                                  local_c8 = insn_info + 0x22c;
                                  break;
                                case 0xc40c:
                                  local_c8 = insn_info + 0x124;
                                  break;
                                case 0xc40d:
                                  local_c8 = insn_info + 0x122;
                                  break;
                                case 0xc40e:
                                  local_c8 = insn_info + 0x15e;
                                  break;
                                case 0xc40f:
                                  local_c8 = insn_info + 0x22b;
                                  break;
                                default:
                                  switch(uVar6) {
                                  case 0xeb8e:
                                    local_c8 = insn_info + 0x1b7;
                                    break;
                                  case 0xeb8f:
                                    local_c8 = insn_info + 0x9e;
                                    break;
                                  case 0xeb90:
                                    local_c8 = insn_info + 0x244;
                                    break;
                                  case 0xeb91:
                                  case 0xeb92:
                                  case 0xeb93:
                                  case 0xeb94:
                                  case 0xeb95:
                                  case 0xeb97:
                                  case 0xeb99:
                                    goto switchD_00ae616d_caseD_eb7b;
                                  case 0xeb96:
                                    local_c8 = insn_info + 0x1ab;
                                    break;
                                  case 0xeb98:
                                    local_c8 = insn_info + 0x1a9;
                                    break;
                                  case 0xeb9a:
                                    local_c8 = insn_info + 0x1ad;
                                    break;
                                  case 0xeb9b:
                                    local_c8 = insn_info + 0x248;
                                    break;
                                  default:
                                    switch(uVar6) {
                                    case 0xb299:
                                      local_c8 = insn_info + 0x20b;
                                      break;
                                    case 0xb29a:
                                    case 0xb29b:
                                    case 0xb29e:
                                    case 0xb29f:
                                    case 0xb2a0:
                                    case 0xb2a1:
                                    case 0xb2a2:
                                    case 0xb2a3:
                                    case 0xb2a4:
                                      goto switchD_00ae616d_caseD_eb7b;
                                    case 0xb29c:
                                      local_c8 = insn_info + 0x242;
                                      break;
                                    case 0xb29d:
                                      local_c8 = insn_info + 0x198;
                                      break;
                                    case 0xb2a5:
                                      local_c8 = insn_info + 0x27d;
                                      break;
                                    case 0xb2a6:
                                      local_c8 = insn_info + 0xe0;
                                      break;
                                    case 0xb2a7:
                                      local_c8 = insn_info + 0xde;
                                      break;
                                    default:
                                      switch(uVar6) {
                                      case 0xb2b0:
                                        local_c8 = insn_info + 0x241;
                                        break;
                                      case 0xb2b1:
                                        local_c8 = insn_info + 0x342;
                                        break;
                                      case 0xb2b2:
                                        local_c8 = insn_info + 0x327;
                                        break;
                                      case 0xb2b3:
                                      case 0xb2b4:
                                      case 0xb2b5:
                                      case 0xb2b6:
                                      case 0xb2b7:
                                      case 0xb2ba:
                                      case 0xb2bb:
                                      case 0xb2bc:
                                        goto switchD_00ae616d_caseD_eb7b;
                                      case 0xb2b8:
                                        local_c8 = insn_info + 0x20c;
                                        break;
                                      case 0xb2b9:
                                        local_c8 = insn_info + 0x20d;
                                        break;
                                      case 0xb2bd:
                                        local_c8 = insn_info + 0x199;
                                        break;
                                      default:
                                        switch(uVar6) {
                                        case 0xcc06:
                                          local_c8 = insn_info + 0x52;
                                          break;
                                        case 0xcc07:
                                        case 0xcc09:
                                        case 0xcc0c:
                                        case 0xcc0e:
                                          goto switchD_00ae616d_caseD_eb7b;
                                        case 0xcc08:
                                          local_c8 = insn_info + 0x16;
                                          break;
                                        case 0xcc0a:
                                          local_c8 = insn_info + 0x2c;
                                          break;
                                        case 0xcc0b:
                                          local_c8 = insn_info + 0x2d;
                                          break;
                                        case 0xcc0d:
                                          local_c8 = insn_info + 0x83;
                                          break;
                                        case 0xcc0f:
                                          local_c8 = insn_info + 0x96;
                                          break;
                                        default:
                                          switch(uVar6) {
                                          case 0xe554:
                                            local_c8 = insn_info + 0x7b;
                                            break;
                                          case 0xe555:
                                            local_c8 = insn_info + 0x93;
                                            break;
                                          case 0xe556:
                                          case 0xe557:
                                          case 0xe55a:
                                          case 0xe55b:
                                            goto switchD_00ae616d_caseD_eb7b;
                                          case 0xe558:
                                            local_c8 = insn_info + 0x7d;
                                            break;
                                          case 0xe559:
                                            local_c8 = insn_info + 0x95;
                                            break;
                                          case 0xe55c:
                                            local_c8 = insn_info + 0x7c;
                                            break;
                                          case 0xe55d:
                                            local_c8 = insn_info + 0x94;
                                            break;
                                          default:
                                            switch(uVar6) {
                                            case 0x107:
                                              local_c8 = insn_info + 0x335;
                                              break;
                                            case 0x108:
                                            case 0x109:
                                            case 0x10a:
                                              goto switchD_00ae616d_caseD_eb7b;
                                            case 0x10b:
                                              local_c8 = insn_info + 0x26e;
                                              break;
                                            case 0x10c:
                                              local_c8 = insn_info + 0x206;
                                              break;
                                            case 0x10d:
                                              local_c8 = insn_info + 0x207;
                                              break;
                                            case 0x10e:
                                              local_c8 = insn_info + 0x208;
                                              break;
                                            default:
                                              switch(uVar6) {
                                              case 0xc800:
                                                local_c8 = insn_info + 0x1bb;
                                                break;
                                              case 0xc801:
                                                local_c8 = insn_info + 0x103;
                                                break;
                                              case 0xc802:
                                                local_c8 = insn_info + 0xb9;
                                                break;
                                              case 0xc803:
                                                goto switchD_00ae616d_caseD_eb7b;
                                              case 0xc804:
                                                local_c8 = insn_info + 0x186;
                                                break;
                                              case 0xc805:
                                                local_c8 = insn_info + 0x187;
                                                break;
                                              default:
                                                switch(uVar6) {
                                                case 0xeb0a:
                                                  local_c8 = insn_info + 0x217;
                                                  break;
                                                case 0xeb0b:
                                                  local_c8 = insn_info + 0x211;
                                                  break;
                                                case 0xeb0c:
                                                  local_c8 = insn_info + 0x21a;
                                                  break;
                                                case 0xeb0d:
                                                  local_c8 = insn_info + 0x214;
                                                  break;
                                                case 0xeb0e:
                                                case 0xeb0f:
                                                case 0xeb10:
                                                case 0xeb11:
                                                case 0xeb12:
                                                case 0xeb13:
                                                  goto switchD_00ae616d_caseD_eb7b;
                                                case 0xeb14:
                                                  local_c8 = insn_info + 0xb4;
                                                  break;
                                                default:
                                                  switch(uVar6) {
                                                  case 0xeb7a:
                                                    local_c8 = insn_info + 0x14;
                                                    break;
                                                  case 0xeb7b:
                                                  case 0xeb7c:
                                                  case 0xeb7d:
                                                  case 0xeb7f:
                                                    goto switchD_00ae616d_caseD_eb7b;
                                                  case 0xeb7e:
                                                    local_c8 = insn_info + 0x2a;
                                                    break;
                                                  case 0xeb80:
                                                    local_c8 = insn_info + 0x10b;
                                                    break;
                                                  case 0xeb81:
                                                    local_c8 = insn_info + 0x10a;
                                                    break;
                                                  default:
                                                    switch(uVar6) {
                                                    case 0xed64:
                                                      local_c8 = insn_info + 0x11f;
                                                      break;
                                                    case 0xed65:
                                                      local_c8 = insn_info + 0x11c;
                                                      break;
                                                    case 0xed66:
                                                      local_c8 = insn_info + 0x22a;
                                                      break;
                                                    case 0xed67:
                                                      local_c8 = insn_info + 0x228;
                                                      break;
                                                    default:
                                                      if (uVar6 == 0x400) {
                                                        local_c8 = insn_info + 0x20e;
                                                      }
                                                      else if (uVar6 == 0x500) {
                                                        local_c8 = insn_info + 0x42;
                                                      }
                                                      else if (uVar6 == 0x600) {
                                                        local_c8 = insn_info + 0x4c;
                                                      }
                                                      else if (uVar6 == 0x700) {
                                                        local_c8 = insn_info + 0x48;
                                                      }
                                                      else if (uVar6 == 0xa00) {
                                                        local_c8 = insn_info + 0x26d;
                                                      }
                                                      else if (uVar6 == 0xd00) {
                                                        local_c8 = insn_info + 0x44;
                                                      }
                                                      else if (uVar6 == 0xe00) {
                                                        local_c8 = insn_info + 0x1b5;
                                                      }
                                                      else if (uVar6 == 0xf00) {
                                                        local_c8 = insn_info + 0x9c;
                                                      }
                                                      else if (uVar6 == 0x1000) {
                                                        local_c8 = insn_info + 0x189;
                                                      }
                                                      else if (uVar6 == 0x1100) {
                                                        local_c8 = insn_info + 0x176;
                                                      }
                                                      else if (uVar6 == 0x1200) {
                                                        local_c8 = insn_info + 0x134;
                                                      }
                                                      else if (uVar6 == 0x1300) {
                                                        local_c8 = insn_info + 0x147;
                                                      }
                                                      else if (uVar6 == 0x1400) {
                                                        local_c8 = insn_info + 0x32;
                                                      }
                                                      else if (uVar6 == 0x1500) {
                                                        local_c8 = insn_info + 0x84;
                                                      }
                                                      else if (uVar6 == 0x1600) {
                                                        local_c8 = insn_info + 0x1e3;
                                                      }
                                                      else if (uVar6 == 0x1700) {
                                                        local_c8 = insn_info + 0xf3;
                                                      }
                                                      else if (uVar6 == 0x1800) {
                                                        local_c8 = insn_info + 0x113;
                                                      }
                                                      else if (uVar6 == 0x1900) {
                                                        local_c8 = insn_info + 0x60;
                                                      }
                                                      else if (uVar6 == 0x1a00) {
                                                        local_c8 = insn_info;
                                                      }
                                                      else if (uVar6 == 0x1b00) {
                                                        local_c8 = insn_info + 0x24a;
                                                      }
                                                      else if (uVar6 == 0x1c00) {
                                                        local_c8 = insn_info + 0x1be;
                                                      }
                                                      else if (uVar6 == 0x1d00) {
                                                        local_c8 = insn_info + 0xe4;
                                                      }
                                                      else if (uVar6 == 0x1e00) {
                                                        local_c8 = insn_info + 0x1b;
                                                      }
                                                      else if (uVar6 == 0x1f00) {
                                                        local_c8 = insn_info + 0x25c;
                                                      }
                                                      else if (uVar6 == 0x2800) {
                                                        local_c8 = insn_info + 0x11a;
                                                      }
                                                      else if (uVar6 == 0x3800) {
                                                        local_c8 = insn_info + 0x11d;
                                                      }
                                                      else if (uVar6 == 0x4000) {
                                                        local_c8 = insn_info + 0x233;
                                                      }
                                                      else if (uVar6 == 0x4100) {
                                                        local_c8 = insn_info + 0x125;
                                                      }
                                                      else if (uVar6 == 0x4200) {
                                                        local_c8 = insn_info + 0x22d;
                                                      }
                                                      else if (uVar6 == 0x4300) {
                                                        local_c8 = insn_info + 0x107;
                                                      }
                                                      else if (uVar6 == 0x4400) {
                                                        local_c8 = insn_info + 0xff;
                                                      }
                                                      else if (uVar6 == 0x4500) {
                                                        local_c8 = insn_info + 0x43;
                                                      }
                                                      else if (uVar6 == 0x4600) {
                                                        local_c8 = insn_info + 0x4e;
                                                      }
                                                      else if (uVar6 == 0x4700) {
                                                        local_c8 = insn_info + 0x49;
                                                      }
                                                      else if (uVar6 == 0x4800) {
                                                        local_c8 = insn_info + 0x151;
                                                      }
                                                      else if (uVar6 == 0x4900) {
                                                        local_c8 = insn_info + 0x76;
                                                      }
                                                      else if (uVar6 == 0x4a00) {
                                                        local_c8 = insn_info + 0x17;
                                                      }
                                                      else if (uVar6 == 0x4b00) {
                                                        local_c8 = insn_info + 600;
                                                      }
                                                      else if (uVar6 == 0x4c00) {
                                                        local_c8 = insn_info + 0x1ca;
                                                      }
                                                      else if (uVar6 == 0x4d00) {
                                                        local_c8 = insn_info + 0x45;
                                                      }
                                                      else if (uVar6 == 0x4e00) {
                                                        local_c8 = insn_info + 0xc4;
                                                      }
                                                      else if (uVar6 == 0x5000) {
                                                        local_c8 = insn_info + 0x224;
                                                      }
                                                      else if (uVar6 == 0x5100) {
                                                        local_c8 = insn_info + 0x127;
                                                      }
                                                      else if (uVar6 == 0x5400) {
                                                        local_c8 = insn_info + 0x34;
                                                      }
                                                      else if (uVar6 == 0x5500) {
                                                        local_c8 = insn_info + 0x85;
                                                      }
                                                      else if (uVar6 == 0x5600) {
                                                        local_c8 = insn_info + 0x1e5;
                                                      }
                                                      else if (uVar6 == 0x5700) {
                                                        local_c8 = insn_info + 0xf5;
                                                      }
                                                      else if (uVar6 == 0x5800) {
                                                        local_c8 = insn_info + 0x114;
                                                      }
                                                      else if (uVar6 == 0x5900) {
                                                        local_c8 = insn_info + 0x61;
                                                      }
                                                      else if (uVar6 == 0x5a00) {
                                                        local_c8 = insn_info + 2;
                                                      }
                                                      else if (uVar6 == 0x5b00) {
                                                        local_c8 = insn_info + 0x24c;
                                                      }
                                                      else if (uVar6 == 0x5c00) {
                                                        local_c8 = insn_info + 0x1bf;
                                                      }
                                                      else if (uVar6 == 0x5d00) {
                                                        local_c8 = insn_info + 0xe5;
                                                      }
                                                      else if (uVar6 == 0x5e00) {
                                                        local_c8 = insn_info + 0x1d;
                                                      }
                                                      else if (uVar6 == 0x5f00) {
                                                        local_c8 = insn_info + 0x25e;
                                                      }
                                                      else if (uVar6 == 0x6000) {
                                                        local_c8 = insn_info + 0x227;
                                                      }
                                                      else if (uVar6 == 0x6800) {
                                                        local_c8 = insn_info + 0x11b;
                                                      }
                                                      else if (uVar6 == 0x7000) {
                                                        local_c8 = insn_info + 0x229;
                                                      }
                                                      else if (uVar6 == 0x7100) {
                                                        local_c8 = insn_info + 0x1d3;
                                                      }
                                                      else if (uVar6 == 0x7800) {
                                                        local_c8 = insn_info + 0x11e;
                                                      }
                                                      else if (uVar6 == 0x8000) {
                                                        local_c8 = insn_info + 0x33a;
                                                      }
                                                      else if (uVar6 == 0x8200) {
                                                        local_c8 = insn_info + 0x326;
                                                      }
                                                      else if (uVar6 == 0x8300) {
                                                        local_c8 = insn_info + 799;
                                                      }
                                                      else if (uVar6 == 0x8400) {
                                                        local_c8 = insn_info + 0x57;
                                                      }
                                                      else if (uVar6 == 0x8500) {
                                                        local_c8 = insn_info + 0x58;
                                                      }
                                                      else if (uVar6 == 0x8600) {
                                                        local_c8 = insn_info + 0x53;
                                                      }
                                                      else if (uVar6 == 0x8700) {
                                                        local_c8 = insn_info + 0x54;
                                                      }
                                                      else if (uVar6 == 0x8800) {
                                                        local_c8 = insn_info + 0x218;
                                                      }
                                                      else if (uVar6 == 0x8900) {
                                                        local_c8 = insn_info + 0x212;
                                                      }
                                                      else if (uVar6 == 0x8a00) {
                                                        local_c8 = insn_info + 0x215;
                                                      }
                                                      else if (uVar6 == 0x8b00) {
                                                        local_c8 = insn_info + 0x20f;
                                                      }
                                                      else if (uVar6 == 0x8c00) {
                                                        local_c8 = insn_info + 0x21e;
                                                      }
                                                      else if (uVar6 == 0x8d00) {
                                                        local_c8 = insn_info + 0x21c;
                                                      }
                                                      else if (uVar6 == 0x8e00) {
                                                        local_c8 = insn_info + 0x21d;
                                                      }
                                                      else if (uVar6 == 0x8f00) {
                                                        local_c8 = insn_info + 0x21b;
                                                      }
                                                      else if (uVar6 == 0x9000) {
                                                        local_c8 = insn_info + 0x243;
                                                      }
                                                      else if (uVar6 == 0x9100) {
                                                        local_c8 = insn_info + 0x274;
                                                      }
                                                      else if (uVar6 == 0x9200) {
                                                        local_c8 = insn_info + 0x1b2;
                                                      }
                                                      else if (uVar6 == 0x9300) {
                                                        local_c8 = insn_info + 0x26f;
                                                      }
                                                      else if (uVar6 == 0x9400) {
                                                        local_c8 = insn_info + 0x40;
                                                      }
                                                      else if (uVar6 == 0x9500) {
                                                        local_c8 = insn_info + 0x91;
                                                      }
                                                      else if (uVar6 == 0x9600) {
                                                        local_c8 = insn_info + 0x1f1;
                                                      }
                                                      else if (uVar6 == 0x9700) {
                                                        local_c8 = insn_info + 0xfd;
                                                      }
                                                      else if (uVar6 == 0x9800) {
                                                        local_c8 = insn_info + 0x1a8;
                                                      }
                                                      else if (uVar6 == 0x9a00) {
                                                        local_c8 = insn_info + 0x1ac;
                                                      }
                                                      else if (uVar6 == 0x9b00) {
                                                        local_c8 = insn_info + 0x247;
                                                      }
                                                      else if (uVar6 == 0xa800) {
                                                        local_c8 = insn_info + 0x1b6;
                                                      }
                                                      else if (uVar6 == 0xa900) {
                                                        local_c8 = insn_info + 0x9d;
                                                      }
                                                      else if (uVar6 == 0xac00) {
                                                        local_c8 = insn_info + 0x345;
                                                      }
                                                      else if (uVar6 == 0xad00) {
                                                        local_c8 = insn_info + 0x346;
                                                      }
                                                      else if (uVar6 == 0xae00) {
                                                        local_c8 = insn_info + 0x33b;
                                                      }
                                                      else if (uVar6 == 0xb100) {
                                                        local_c8 = insn_info + 0x328;
                                                      }
                                                      else if (uVar6 == 0xb2e8) {
                                                        local_c8 = insn_info + 0x1f8;
                                                      }
                                                      else if (uVar6 == 0xb600) {
                                                        local_c8 = insn_info + 0x33d;
                                                      }
                                                      else if (uVar6 == 0xb700) {
                                                        local_c8 = insn_info + 0x323;
                                                      }
                                                      else if (uVar6 == 0xbb00) {
                                                        local_c8 = insn_info + 0xb6;
                                                      }
                                                      else if (uVar6 == 0xbd00) {
                                                        local_c8 = insn_info + 0x9f;
                                                      }
                                                      else if (uVar6 == 0xbe00) {
                                                        local_c8 = insn_info + 0x230;
                                                      }
                                                      else if (uVar6 == 0xbf00) {
                                                        local_c8 = insn_info + 0x109;
                                                      }
                                                      else if (uVar6 == 0xc500) {
                                                        local_c8 = insn_info + 0x5c;
                                                      }
                                                      else if (uVar6 == 0xc700) {
                                                        local_c8 = insn_info + 0x5b;
                                                      }
                                                      else if (uVar6 == 0xd000) {
                                                        local_c8 = insn_info + 0x27c;
                                                      }
                                                      else if (uVar6 == 0xd100) {
                                                        local_c8 = insn_info + 0x1b8;
                                                      }
                                                      else if (uVar6 == 0xd200) {
                                                        local_c8 = insn_info + 0x1ae;
                                                      }
                                                      else if (uVar6 == 0xd300) {
                                                        local_c8 = insn_info + 0x1bd;
                                                      }
                                                      else if (uVar6 == 0xd400) {
                                                        local_c8 = insn_info + 0x39;
                                                      }
                                                      else if (uVar6 == 0xd500) {
                                                        local_c8 = insn_info + 0x8b;
                                                      }
                                                      else if (uVar6 == 0xd600) {
                                                        local_c8 = insn_info + 0x1ea;
                                                      }
                                                      else if (uVar6 == 0xd700) {
                                                        local_c8 = insn_info + 0xfa;
                                                      }
                                                      else if (uVar6 == 0xda00) {
                                                        local_c8 = insn_info + 0x32d;
                                                      }
                                                      else if (uVar6 == 0xdb00) {
                                                        local_c8 = insn_info + 0x32e;
                                                      }
                                                      else if (uVar6 == 0xdc00) {
                                                        local_c8 = insn_info + 0x27a;
                                                      }
                                                      else if (uVar6 == 0xdd00) {
                                                        local_c8 = insn_info + 0x27b;
                                                      }
                                                      else if (uVar6 == 0xe100) {
                                                        local_c8 = insn_info + 0x1f5;
                                                      }
                                                      else if (uVar6 == 0xe200) {
                                                        local_c8 = insn_info + 0x284;
                                                      }
                                                      else if (uVar6 == 0xe501) {
                                                        local_c8 = insn_info + 0x34a;
                                                      }
                                                      else if (uVar6 == 0xe544) {
                                                        local_c8 = insn_info + 0x1af;
                                                      }
                                                      else if (uVar6 == 0xe548) {
                                                        local_c8 = insn_info + 0x1b1;
                                                      }
                                                      else if (uVar6 == 0xe54c) {
                                                        local_c8 = insn_info + 0x1b0;
                                                      }
                                                      else if (uVar6 == 0xe900) {
                                                        local_c8 = insn_info + 500;
                                                      }
                                                      else if (uVar6 == 0xea00) {
                                                        local_c8 = insn_info + 0x283;
                                                      }
                                                      else if (uVar6 == 0xeb04) {
                                                        local_c8 = insn_info + 0x1aa;
                                                      }
                                                      else if (uVar6 == 0xeb6a) {
                                                        local_c8 = insn_info + 0x11;
                                                      }
                                                      else if (uVar6 == 0xeb6e) {
                                                        local_c8 = insn_info + 0x28;
                                                      }
                                                      else if (uVar6 == 0xebc0) {
                                                        local_c8 = insn_info + 0x273;
                                                      }
                                                      else if (uVar6 == 0xf100) {
                                                        local_c8 = insn_info + 0x1bc;
                                                      }
                                                      else if (uVar6 == 0xf200) {
                                                        local_c8 = insn_info + 499;
                                                      }
                                                      else {
                                                        if (uVar6 != 0xf300)
                                                        goto switchD_00ae616d_caseD_eb7b;
                                                        local_c8 = insn_info + 0x282;
                                                      }
                                                    }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  s->insn = local_c8;
  bVar15 = local_c8->field_0x4;
  uVar16 = 0;
  for (lVar17 = 0; lVar17 != 7; lVar17 = lVar17 + 1) {
    DVar1 = format_info[bVar15].op[lVar17];
    uVar6 = (uint)DVar1 >> 8 & 0xff;
    if (uVar6 != 0) {
      uVar21 = (uVar20 << (DVar1._0_1_ & 0x3f)) >> (-DVar1._1_1_ & 0x3fU);
      uVar19 = (uint)uVar21;
      switch((uint)DVar1 >> 0x10 & 3) {
      case 1:
        if (0x20 < uVar6) {
          __assert_fail("f->size <= 32",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
                        ,0x1956,"void extract_field(DisasFields *, const DisasField *, uint64_t)");
        }
        bVar13 = DVar1._1_1_ - 1;
        uVar19 = (uVar19 ^ 1 << (bVar13 & 0x1f)) - (1 << (bVar13 & 0x1f));
        break;
      case 2:
        uVar19 = uVar19 >> 8 | (int)(char)uVar21 << 0xc;
        break;
      case 3:
        if (uVar6 != 4) {
          g_assertion_message_expr
                    ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
                     ,0x195e,"f->size == 4");
        }
        switch(((uint)DVar1 & 0xff) << 0x1e | ((uint)DVar1 & 0xff) - 8 >> 2) {
        case 0:
          uVar19 = uVar19 | (uint)(uVar20 >> 0x17) & 0x10;
          break;
        case 1:
          uVar19 = uVar19 | (uint)(uVar20 >> 0x16) & 0x10;
          break;
        case 2:
          uVar19 = uVar19 | (uint)(uVar20 >> 0x15) & 0x10;
          break;
        case 6:
          uVar19 = uVar19 | (uint)(uVar20 >> 0x14) & 0x10;
        }
      }
      uVar6 = *(uint *)&(s->fields).field_0x8;
      uVar14 = uVar6 >> 0x10;
      uVar12 = (uint)DVar1 >> 0x12 & 0x3f;
      if ((uVar14 >> ((uint)DVar1 >> 0x12 & 0x1f) & 1) != 0) {
        __assert_fail("((o->presentC >> f->indexC) & 1) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
                      ,0x1977,"void extract_field(DisasFields *, const DisasField *, uint64_t)");
      }
      *(uint *)&(s->fields).field_0x8 =
           uVar6 & 0xffff | (uVar14 | 1 << ((byte)uVar12 & 0x1f)) << 0x10;
      uVar16 = uVar16 | 1 << ((uint)DVar1 >> 0x18 & 0x1f);
      (s->fields).presentO = uVar16;
      (s->fields).c[uVar12] = uVar19;
    }
  }
  a2 = (target_ulong)s->ilen;
LAB_00ae8a2e:
  tcg_gen_insn_start(tcg_ctx,pc,(ulong)s->cc_op,a2);
  addr_00 = (s->base).pc_next;
  val = s->uc;
  _Var3 = _hook_exists_bounded(val->hook[2].head,addr_00);
  if (_Var3) {
    pTVar9 = tcg_const_i32_s390x(tcg_ctx,s->ilen);
    pTVar10 = tcg_const_i64_s390x(tcg_ctx,(int64_t)val);
    pTVar11 = tcg_const_i64_s390x(tcg_ctx,addr_00);
    ts = (TCGTemp *)(pTVar10 + (long)tcg_ctx);
    ts_00 = (TCGTemp *)(pTVar11 + (long)tcg_ctx);
    ts_01 = (TCGTemp *)(pTVar9 + (long)tcg_ctx);
    local_60 = (TCGTemp *)0x0;
    local_78 = ts;
    local_70 = ts_00;
    local_68 = ts_01;
    if (val->hooks_count[2] == 1) {
      plVar18 = (list_item *)(val->hook + 2);
      while (plVar18 = plVar18->next, plVar18 != (list_item *)0x0) {
        phVar2 = (hook *)plVar18->data;
        if (phVar2->to_delete == false) {
          pTVar10 = tcg_const_i64_s390x(tcg_ctx,(int64_t)phVar2->user_data);
          local_60 = (TCGTemp *)(pTVar10 + (long)tcg_ctx);
          (*val->add_inline_hook)(val,phVar2,&local_78,4);
          tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(pTVar10 + (long)tcg_ctx));
        }
      }
    }
    else {
      pTVar9 = tcg_const_i32_s390x(tcg_ctx,2);
      local_58 = ts_01;
      local_50 = (TCGTemp *)(pTVar9 + (long)tcg_ctx);
      local_48 = ts;
      local_40 = ts_00;
      tcg_gen_callN_s390x(tcg_ctx,helper_uc_tracecode,(TCGTemp *)0x0,4,&local_58);
      tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(pTVar9 + (long)tcg_ctx));
    }
    tcg_temp_free_internal_s390x(tcg_ctx,ts_00);
    tcg_temp_free_internal_s390x(tcg_ctx,ts);
    tcg_temp_free_internal_s390x(tcg_ctx,ts_01);
    check_exit_request_s390x(tcg_ctx);
  }
  iVar8 = 2;
  if (local_c8 == (DisasInsn *)0x0) {
    iVar8 = 1;
    goto LAB_00ae8d5e;
  }
  if ((int)((s->base).tb)->flags < 0) {
    pTVar10 = tcg_const_i64_s390x(tcg_ctx,(s->base).pc_next);
    local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_50 = (TCGTemp *)(pTVar10 + (long)tcg_ctx);
    tcg_gen_callN_s390x(tcg_ctx,helper_per_ifetch,(TCGTemp *)0x0,2,&local_58);
    tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(pTVar10 + (long)tcg_ctx));
  }
  uVar21 = *(ulong *)local_c8;
  uVar16 = (uint)uVar21;
  if (0xffff < uVar16) {
    uVar6 = ((s->base).tb)->flags;
    if ((uVar16 >> 0x15 & 1) != 0 && (uVar6 >> 0x11 & 1) != 0) goto LAB_00ae8d5e;
    if ((uVar6 >> 0x1e & 1) == 0) {
      if ((uVar16 >> 0x10 & 1) == 0) {
        bVar15 = 0;
      }
      else {
        iVar8 = get_field1(s,FLD_O_r1,FLD_C_b1);
        bVar15 = 6 < iVar8 | (byte)iVar8 & 1;
        uVar21 = *(ulong *)local_c8;
      }
      if (((uint)uVar21 >> 0x11 & 1) != 0) {
        uVar16 = get_field1(s,FLD_O_r2,FLD_C_b2);
        if ((uVar16 & 1) != 0) {
          bVar15 = 1;
        }
        if (6 < (int)uVar16) {
          bVar15 = 1;
        }
        uVar21 = *(ulong *)local_c8;
      }
      if (((uint)uVar21 >> 0x12 & 1) != 0) {
        uVar16 = get_field1(s,FLD_O_r3,FLD_C_i3);
        if ((uVar16 & 1) != 0) {
          bVar15 = 1;
        }
        if (6 < (int)uVar16) {
          bVar15 = 1;
        }
        uVar21 = *(ulong *)local_c8;
      }
      if (((uint)uVar21 >> 0x13 & 1) != 0) {
        bVar15 = 2;
      }
      bVar13 = 3;
      if (((uint)uVar21 >> 0x14 & 1) == 0) {
        bVar13 = bVar15;
      }
      uVar20 = uVar21 & 0x400000;
      bVar15 = 0xfe;
      if (uVar20 == 0) {
        bVar15 = bVar13;
      }
      if (bVar15 != 0) {
        gen_data_exception(tcg_ctx,bVar15);
        return DISAS_NORETURN;
      }
    }
    else {
      uVar20 = (ulong)(uVar16 & 0x400000);
    }
    if ((uVar20 != 0) && ((((s->base).tb)->flags & 0x20000000) == 0)) {
      gen_data_exception(tcg_ctx,0xfe);
      return DISAS_NORETURN;
    }
  }
  if ((char)(uVar21 >> 0x30) != '\0') {
    if ((uVar21 >> 0x30 & 1) == 0) {
LAB_00ae8c3e:
      if ((uVar21 >> 0x31 & 1) != 0) {
        uVar16 = get_field1(s,FLD_O_r2,FLD_C_b2);
        if ((uVar16 & 1) != 0) goto LAB_00ae8d50;
        uVar21 = *(ulong *)local_c8;
      }
      if ((uVar21 >> 0x32 & 1) != 0) {
        uVar16 = get_field1(s,FLD_O_r3,FLD_C_i3);
        if ((uVar16 & 1) != 0) goto LAB_00ae8d50;
        uVar21 = *(ulong *)local_c8;
      }
      if ((uVar21 >> 0x33 & 1) != 0) {
        uVar16 = get_field1(s,FLD_O_r1,FLD_C_b1);
        if ((uVar16 & 2) != 0) goto LAB_00ae8d50;
        uVar21 = *(ulong *)local_c8;
      }
      if (((uVar21 >> 0x34 & 1) == 0) ||
         (uVar16 = get_field1(s,FLD_O_r2,FLD_C_b2), (uVar16 & 2) == 0)) goto LAB_00ae8cb9;
    }
    else {
      uVar16 = get_field1(s,FLD_O_r1,FLD_C_b1);
      if ((uVar16 & 1) == 0) {
        uVar21 = *(ulong *)local_c8;
        goto LAB_00ae8c3e;
      }
    }
LAB_00ae8d50:
    iVar8 = 6;
LAB_00ae8d5e:
    gen_program_exception(s,iVar8);
    return DISAS_NORETURN;
  }
LAB_00ae8cb9:
  if (local_c8->help_in1 != (_func_void_DisasContext_ptr_DisasOps_ptr *)0x0) {
    (*local_c8->help_in1)(s,&o);
  }
  if (local_c8->help_in2 != (_func_void_DisasContext_ptr_DisasOps_ptr *)0x0) {
    (*local_c8->help_in2)(s,&o);
  }
  if (local_c8->help_prep != (_func_void_DisasContext_ptr_DisasOps_ptr *)0x0) {
    (*local_c8->help_prep)(s,&o);
  }
  if (local_c8->help_op == (_func_DisasJumpType_DisasContext_ptr_DisasOps_ptr *)0x0) {
    DVar7 = DISAS_NEXT;
  }
  else {
    DVar7 = (*local_c8->help_op)(s,&o);
    if (DVar7 == DISAS_NORETURN) {
      DVar7 = DISAS_NORETURN;
      goto LAB_00ae8da0;
    }
  }
  if (local_c8->help_wout != (_func_void_DisasContext_ptr_DisasOps_ptr *)0x0) {
    (*local_c8->help_wout)(s,&o);
  }
  if (local_c8->help_cout != (_func_void_DisasContext_ptr_DisasOps_ptr *)0x0) {
    (*local_c8->help_cout)(s,&o);
  }
LAB_00ae8da0:
  if ((o.out != (TCGv_i64)0x0) && (o.g_out == false)) {
    tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(o.out + (long)tcg_ctx));
  }
  if ((o.out2 != (TCGv_i64)0x0) && (o.g_out2 == false)) {
    tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(o.out2 + (long)tcg_ctx));
  }
  if ((o.in1 != (TCGv_i64)0x0) && (o.g_in1 == false)) {
    tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(o.in1 + (long)tcg_ctx));
  }
  if ((o.in2 != (TCGv_i64)0x0) && (o.g_in2 == false)) {
    tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(o.in2 + (long)tcg_ctx));
  }
  if (o.addr1 != (TCGv_i64)0x0) {
    tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(o.addr1 + (long)tcg_ctx));
  }
  if ((int)((s->base).tb)->flags < 0) {
    if ((DVar7 == DISAS_TARGET_3) || (DVar7 == DISAS_NEXT)) {
      tcg_gen_movi_i64_s390x(tcg_ctx,tcg_ctx->psw_addr,s->pc_tmp);
    }
    local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    tcg_gen_callN_s390x(tcg_ctx,helper_per_check_exception,(TCGTemp *)0x0,1,&local_58);
  }
  (s->base).pc_next = s->pc_tmp;
  return DVar7;
}

Assistant:

static DisasJumpType translate_one(CPUS390XState *env, DisasContext *s)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    const DisasInsn *insn;
    DisasJumpType ret = DISAS_NEXT;
    DisasOps o = { 0 };

    /* Search for the insn in the table.  */
    insn = extract_insn(env, s);

    /* Emit insn_start now that we know the ILEN.  */
    tcg_gen_insn_start(tcg_ctx, s->base.pc_next, s->cc_op, s->ilen);

    // Unicorn: trace this instruction on request
    if (HOOK_EXISTS_BOUNDED(s->uc, UC_HOOK_CODE, s->base.pc_next)) {
        gen_uc_tracecode(tcg_ctx, s->ilen, UC_HOOK_CODE_IDX, s->uc, s->base.pc_next);
        // the callback might want to stop emulation immediately
        check_exit_request(tcg_ctx);
    }

    /* Not found means unimplemented/illegal opcode.  */
    if (insn == NULL) {
        // qemu_log_mask(LOG_UNIMP, "unimplemented opcode 0x%02x%02x\n",
        //               s->fields.op, s->fields.op2);
        gen_illegal_opcode(s);
        return DISAS_NORETURN;
    }

    if (s->base.tb->flags & FLAG_MASK_PER) {
        TCGv_i64 addr = tcg_const_i64(tcg_ctx, s->base.pc_next);
        gen_helper_per_ifetch(tcg_ctx, tcg_ctx->cpu_env, addr);
        tcg_temp_free_i64(tcg_ctx, addr);
    }

    /* process flags */
    if (insn->flags) {
        /* privileged instruction */
        if ((s->base.tb->flags & FLAG_MASK_PSTATE) && (insn->flags & IF_PRIV)) {
            gen_program_exception(s, PGM_PRIVILEGED);
            return DISAS_NORETURN;
        }

        /* if AFP is not enabled, instructions and registers are forbidden */
        if (!(s->base.tb->flags & FLAG_MASK_AFP)) {
            uint8_t dxc = 0;

            if ((insn->flags & IF_AFP1) && is_afp_reg(get_field(s, r1))) {
                dxc = 1;
            }
            if ((insn->flags & IF_AFP2) && is_afp_reg(get_field(s, r2))) {
                dxc = 1;
            }
            if ((insn->flags & IF_AFP3) && is_afp_reg(get_field(s, r3))) {
                dxc = 1;
            }
            if (insn->flags & IF_BFP) {
                dxc = 2;
            }
            if (insn->flags & IF_DFP) {
                dxc = 3;
            }
            if (insn->flags & IF_VEC) {
                dxc = 0xfe;
            }
            if (dxc) {
                gen_data_exception(tcg_ctx, dxc);
                return DISAS_NORETURN;
            }
        }

        /* if vector instructions not enabled, executing them is forbidden */
        if (insn->flags & IF_VEC) {
            if (!((s->base.tb->flags & FLAG_MASK_VECTOR))) {
                gen_data_exception(tcg_ctx, 0xfe);
                return DISAS_NORETURN;
            }
        }
    }

    /* Check for insn specification exceptions.  */
    if (insn->spec) {
        if ((insn->spec & SPEC_r1_even && get_field(s, r1) & 1) ||
            (insn->spec & SPEC_r2_even && get_field(s, r2) & 1) ||
            (insn->spec & SPEC_r3_even && get_field(s, r3) & 1) ||
            (insn->spec & SPEC_r1_f128 && !is_fp_pair(get_field(s, r1))) ||
            (insn->spec & SPEC_r2_f128 && !is_fp_pair(get_field(s, r2)))) {
            gen_program_exception(s, PGM_SPECIFICATION);
            return DISAS_NORETURN;
        }
    }

    /* Implement the instruction.  */
    if (insn->help_in1) {
        insn->help_in1(s, &o);
    }
    if (insn->help_in2) {
        insn->help_in2(s, &o);
    }
    if (insn->help_prep) {
        insn->help_prep(s, &o);
    }
    if (insn->help_op) {
        ret = insn->help_op(s, &o);
    }
    if (ret != DISAS_NORETURN) {
        if (insn->help_wout) {
            insn->help_wout(s, &o);
        }
        if (insn->help_cout) {
            insn->help_cout(s, &o);
        }
    }

    /* Free any temporaries created by the helpers.  */
    if (o.out && !o.g_out) {
        tcg_temp_free_i64(tcg_ctx, o.out);
    }
    if (o.out2 && !o.g_out2) {
        tcg_temp_free_i64(tcg_ctx, o.out2);
    }
    if (o.in1 && !o.g_in1) {
        tcg_temp_free_i64(tcg_ctx, o.in1);
    }
    if (o.in2 && !o.g_in2) {
        tcg_temp_free_i64(tcg_ctx, o.in2);
    }
    if (o.addr1) {
        tcg_temp_free_i64(tcg_ctx, o.addr1);
    }

    if (s->base.tb->flags & FLAG_MASK_PER) {
        /* An exception might be triggered, save PSW if not already done.  */
        if (ret == DISAS_NEXT || ret == DISAS_PC_STALE) {
            tcg_gen_movi_i64(tcg_ctx, tcg_ctx->psw_addr, s->pc_tmp);
        }

        /* Call the helper to check for a possible PER exception.  */
        gen_helper_per_check_exception(tcg_ctx, tcg_ctx->cpu_env);
    }

    /* Advance to the next instruction.  */
    s->base.pc_next = s->pc_tmp;
    return ret;
}